

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_pack1to16.h
# Opt level: O0

void ncnn::deconvolution_pack1to16_avx512
               (Mat *bottom_blob,Mat *top_blob,Mat *weight_data_packed,Mat *bias_data,int kernel_w,
               int kernel_h,int dilation_w,int dilation_h,int stride_w,int stride_h,
               int activation_type,Mat *activation_params,Option *opt)

{
  int iVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  byte bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  undefined8 uVar19;
  ulong uVar20;
  ushort uVar21;
  long *plVar22;
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  long lVar99;
  long lVar100;
  long lVar101;
  long lVar102;
  undefined1 auVar103 [32];
  undefined1 auVar104 [40];
  undefined1 auVar105 [48];
  undefined1 auVar106 [56];
  undefined1 auVar107 [32];
  undefined1 auVar108 [40];
  undefined1 auVar109 [48];
  undefined1 auVar110 [56];
  int iVar111;
  int iVar112;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  undefined1 auVar115 [64];
  undefined1 auVar116 [64];
  undefined1 auVar117 [64];
  undefined1 auVar118 [64];
  undefined1 auVar119 [64];
  int in_stack_00000008;
  undefined4 in_stack_00000034;
  __m512 _w;
  __m512 _val;
  int k;
  float val;
  int sx;
  int sxs;
  int x;
  float *sptr;
  int sy;
  int sys;
  int y;
  Mat m_2;
  int q;
  float *kptr;
  __m512 _sum;
  int j;
  int i;
  int outh;
  int outw;
  int channels;
  int h;
  int w;
  int maxk;
  float *outptr;
  int p;
  float *bias_data_ptr;
  int kernel_extent_h;
  int kernel_extent_w;
  int outch;
  Mat *m;
  Mat *m_3;
  Mat *m_1;
  __m512 _b;
  __m512 _a;
  __m512 max;
  __m512 min;
  __mmask16 _is_negative;
  __m512 one;
  __m512 one_7;
  __m512 pow2n_1;
  __m512 y_2;
  __mmask16 mask_1;
  __m512 one_2;
  __m512i imm0_1;
  __m512 fx_1;
  __m512 tmp_1;
  __m512 pow2n;
  __m512 y_1;
  __mmask16 mask;
  __m512 one_1;
  __m512i imm0;
  __m512 fx;
  __m512 tmp;
  __m512 two;
  __m512 one_4;
  __m512 one_5;
  __m512 pow2n_2;
  __m512 y_4;
  __mmask16 mask_3;
  __m512 one_6;
  __m512i imm0_3;
  __m512 fx_2;
  __m512 tmp_3;
  __m512 y_3;
  __m512 z;
  __m512 tmp_2;
  __mmask16 mask_2;
  __m512 e;
  __mmask16 invalid_mask;
  __m512 one_3;
  __m512i imm0_2;
  int local_5ebc;
  int local_5ea4;
  int local_5e54;
  long local_5e08;
  undefined1 local_5e00 [64];
  int local_5d8c;
  int local_5d88;
  undefined1 (*local_5d18) [64];
  int local_5d0c;
  undefined1 local_56c0 [64];
  int local_49c0;
  int iStack_49bc;
  int iStack_49b8;
  int iStack_49b4;
  int iStack_49b0;
  int iStack_49ac;
  int iStack_49a8;
  int iStack_49a4;
  int iStack_49a0;
  int iStack_499c;
  int iStack_4998;
  int iStack_4994;
  int iStack_4990;
  int iStack_498c;
  int iStack_4988;
  int iStack_4984;
  undefined1 local_4740 [256];
  undefined1 local_4640 [16];
  undefined8 uStack_4630;
  undefined8 uStack_4628;
  undefined8 uStack_4620;
  undefined8 uStack_4618;
  undefined8 uStack_4610;
  undefined8 uStack_4608;
  undefined1 local_3d40 [256];
  undefined1 local_3c40 [16];
  undefined8 uStack_3c30;
  undefined8 uStack_3c28;
  undefined8 uStack_3c20;
  undefined8 uStack_3c18;
  undefined8 uStack_3c10;
  undefined8 uStack_3c08;
  int local_3240;
  int iStack_323c;
  int iStack_3238;
  int iStack_3234;
  int iStack_3230;
  int iStack_322c;
  int iStack_3228;
  int iStack_3224;
  int iStack_3220;
  int iStack_321c;
  int iStack_3218;
  int iStack_3214;
  int iStack_3210;
  int iStack_320c;
  int iStack_3208;
  int iStack_3204;
  int local_30c0;
  int iStack_30bc;
  int iStack_30b8;
  int iStack_30b4;
  int iStack_30b0;
  int iStack_30ac;
  int iStack_30a8;
  int iStack_30a4;
  int iStack_30a0;
  int iStack_309c;
  int iStack_3098;
  int iStack_3094;
  int iStack_3090;
  int iStack_308c;
  int iStack_3088;
  int iStack_3084;
  undefined1 local_24c0 [256];
  undefined1 local_23c0 [16];
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  undefined8 uStack_23a0;
  undefined8 uStack_2398;
  undefined8 uStack_2390;
  undefined8 uStack_2388;
  int local_19c0;
  int iStack_19bc;
  int iStack_19b8;
  int iStack_19b4;
  int iStack_19b0;
  int iStack_19ac;
  int iStack_19a8;
  int iStack_19a4;
  int iStack_19a0;
  int iStack_199c;
  int iStack_1998;
  int iStack_1994;
  int iStack_1990;
  int iStack_198c;
  int iStack_1988;
  int iStack_1984;
  undefined1 local_15c0 [256];
  undefined1 local_14c0 [16];
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined8 uStack_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined1 local_13c0 [16];
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 uStack_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  int local_780;
  int iStack_77c;
  int iStack_778;
  int iStack_774;
  int iStack_770;
  int iStack_76c;
  int iStack_768;
  int iStack_764;
  int iStack_760;
  int iStack_75c;
  int iStack_758;
  int iStack_754;
  int iStack_750;
  int iStack_74c;
  int iStack_748;
  int iStack_744;
  int local_140;
  int iStack_13c;
  int iStack_138;
  int iStack_134;
  int iStack_130;
  int iStack_12c;
  int iStack_128;
  int iStack_124;
  int iStack_120;
  int iStack_11c;
  int iStack_118;
  int iStack_114;
  int iStack_110;
  int iStack_10c;
  int iStack_108;
  int iStack_104;
  
  lVar99 = in_RSI[7];
  lVar3 = *in_RCX;
  for (local_5d0c = 0; local_5d0c < (int)lVar99; local_5d0c = local_5d0c + 1) {
    local_5d18 = (undefined1 (*) [64])(*in_RSI + in_RSI[8] * (long)local_5d0c * in_RSI[2]);
    iVar1 = *(int *)((long)in_RDI + 0x2c);
    lVar100 = in_RDI[6];
    lVar101 = in_RDI[7];
    iVar2 = *(int *)((long)in_RSI + 0x2c);
    lVar102 = in_RSI[6];
    for (local_5d88 = 0; local_5d88 < (int)lVar102; local_5d88 = local_5d88 + 1) {
      for (local_5d8c = 0; local_5d8c < iVar2; local_5d8c = local_5d8c + 1) {
        local_5e00 = ZEXT1664(ZEXT816(0));
        if (lVar3 != 0) {
          local_5e00 = *(undefined1 (*) [64])(lVar3 + (long)(local_5d0c << 4) * 4);
        }
        local_5e08 = *in_RDX + in_RDX[8] * (long)local_5d0c * in_RDX[2];
        for (local_5e54 = 0; local_5e54 < (int)lVar101; local_5e54 = local_5e54 + 1) {
          for (local_5ea4 = 0; local_5ea4 < in_R9D; local_5ea4 = local_5ea4 + 1) {
            iVar111 = (local_5d88 + local_5ea4 * dilation_w) - dilation_w * (in_R9D + -1);
            if (((-1 < iVar111) && (iVar111 % stride_w == 0)) && (iVar111 / stride_w < (int)lVar100)
               ) {
              for (local_5ebc = 0; local_5ebc < in_R8D; local_5ebc = local_5ebc + 1) {
                iVar112 = (local_5d8c + local_5ebc * in_stack_00000008) -
                          in_stack_00000008 * (in_R8D + -1);
                if (((-1 < iVar112) && (iVar112 % dilation_h == 0)) &&
                   (iVar112 / dilation_h < iVar1)) {
                  auVar113 = vbroadcastss_avx512f
                                       (ZEXT416(*(uint *)(*in_RDI + in_RDI[8] * (long)local_5e54 *
                                                                    in_RDI[2] +
                                                          (long)*(int *)((long)in_RDI + 0x2c) *
                                                          (long)(iVar111 / stride_w) * in_RDI[2] +
                                                         (long)(iVar112 / dilation_h) * 4)));
                  local_5e00 = vfmadd213ps_avx512f(*(undefined1 (*) [64])
                                                    (local_5e08 +
                                                    (long)((local_5ea4 * in_R8D + local_5ebc) * 0x10
                                                          ) * 4),auVar113,local_5e00);
                }
              }
            }
          }
          local_5e08 = local_5e08 + (long)(in_R8D * in_R9D * 0x10) * 4;
        }
        plVar22 = (long *)CONCAT44(in_stack_00000034,activation_type);
        switch(stride_h) {
        case 1:
          local_56c0 = vmaxps_avx512f(local_5e00,ZEXT1664(ZEXT816(0)));
          break;
        case 2:
          uVar19 = vcmpps_avx512f(local_5e00,ZEXT1664(ZEXT816(0)),1);
          uVar21 = (ushort)uVar19;
          auVar113 = vbroadcastss_avx512f(ZEXT416(*(uint *)*plVar22));
          local_49c0 = local_5e00._0_4_;
          iStack_49bc = local_5e00._4_4_;
          iStack_49b8 = local_5e00._8_4_;
          iStack_49b4 = local_5e00._12_4_;
          iStack_49b0 = local_5e00._16_4_;
          iStack_49ac = local_5e00._20_4_;
          iStack_49a8 = local_5e00._24_4_;
          iStack_49a4 = local_5e00._28_4_;
          iStack_49a0 = local_5e00._32_4_;
          iStack_499c = local_5e00._36_4_;
          iStack_4998 = local_5e00._40_4_;
          iStack_4994 = local_5e00._44_4_;
          iStack_4990 = local_5e00._48_4_;
          iStack_498c = local_5e00._52_4_;
          iStack_4988 = local_5e00._56_4_;
          iStack_4984 = local_5e00._60_4_;
          auVar113 = vmulps_avx512f(local_5e00,auVar113);
          bVar4 = (bool)((byte)uVar19 & 1);
          bVar5 = (bool)((byte)(uVar21 >> 1) & 1);
          bVar6 = (bool)((byte)(uVar21 >> 2) & 1);
          bVar7 = (bool)((byte)(uVar21 >> 3) & 1);
          bVar8 = (bool)((byte)(uVar21 >> 4) & 1);
          bVar9 = (bool)((byte)(uVar21 >> 5) & 1);
          bVar10 = (bool)((byte)(uVar21 >> 6) & 1);
          bVar11 = (bool)((byte)(uVar21 >> 7) & 1);
          bVar12 = (byte)((ulong)uVar19 >> 8);
          bVar13 = (bool)(bVar12 >> 1 & 1);
          bVar14 = (bool)(bVar12 >> 2 & 1);
          bVar15 = (bool)(bVar12 >> 3 & 1);
          bVar16 = (bool)(bVar12 >> 4 & 1);
          bVar17 = (bool)(bVar12 >> 5 & 1);
          bVar18 = (bool)(bVar12 >> 6 & 1);
          local_56c0._4_4_ = (uint)bVar5 * auVar113._4_4_ | (uint)!bVar5 * iStack_49bc;
          local_56c0._0_4_ = (uint)bVar4 * auVar113._0_4_ | (uint)!bVar4 * local_49c0;
          local_56c0._8_4_ = (uint)bVar6 * auVar113._8_4_ | (uint)!bVar6 * iStack_49b8;
          local_56c0._12_4_ = (uint)bVar7 * auVar113._12_4_ | (uint)!bVar7 * iStack_49b4;
          local_56c0._16_4_ = (uint)bVar8 * auVar113._16_4_ | (uint)!bVar8 * iStack_49b0;
          local_56c0._20_4_ = (uint)bVar9 * auVar113._20_4_ | (uint)!bVar9 * iStack_49ac;
          local_56c0._24_4_ = (uint)bVar10 * auVar113._24_4_ | (uint)!bVar10 * iStack_49a8;
          local_56c0._28_4_ = (uint)bVar11 * auVar113._28_4_ | (uint)!bVar11 * iStack_49a4;
          local_56c0._32_4_ =
               (uint)(bVar12 & 1) * auVar113._32_4_ | (uint)!(bool)(bVar12 & 1) * iStack_49a0;
          local_56c0._36_4_ = (uint)bVar13 * auVar113._36_4_ | (uint)!bVar13 * iStack_499c;
          local_56c0._40_4_ = (uint)bVar14 * auVar113._40_4_ | (uint)!bVar14 * iStack_4998;
          local_56c0._44_4_ = (uint)bVar15 * auVar113._44_4_ | (uint)!bVar15 * iStack_4994;
          local_56c0._48_4_ = (uint)bVar16 * auVar113._48_4_ | (uint)!bVar16 * iStack_4990;
          local_56c0._52_4_ = (uint)bVar17 * auVar113._52_4_ | (uint)!bVar17 * iStack_498c;
          local_56c0._56_4_ = (uint)bVar18 * auVar113._56_4_ | (uint)!bVar18 * iStack_4988;
          local_56c0._60_4_ =
               (uint)(bVar12 >> 7) * auVar113._60_4_ | (uint)!(bool)(bVar12 >> 7) * iStack_4984;
          break;
        case 3:
          auVar113 = vbroadcastss_avx512f(ZEXT416(*(uint *)*plVar22));
          auVar118 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*plVar22 + 4)));
          auVar113 = vmaxps_avx512f(local_5e00,auVar113);
          local_56c0 = vminps_avx512f(auVar113,auVar118);
          break;
        case 4:
          auVar119 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
          auVar113 = vsubps_avx512f(ZEXT1664(ZEXT816(0)),local_5e00);
          auVar37._8_4_ = 88.37626;
          auVar37._12_4_ = 88.37626;
          auVar37._0_4_ = 88.37626;
          auVar37._4_4_ = 88.37626;
          auVar37._16_4_ = 88.37626;
          auVar37._20_4_ = 88.37626;
          auVar37._24_4_ = 88.37626;
          auVar37._28_4_ = 88.37626;
          auVar37._32_4_ = 88.37626;
          auVar37._36_4_ = 88.37626;
          auVar37._40_4_ = 88.37626;
          auVar37._44_4_ = 88.37626;
          auVar37._48_4_ = 88.37626;
          auVar37._52_4_ = 88.37626;
          auVar37._56_4_ = 88.37626;
          auVar37._60_4_ = 88.37626;
          auVar113 = vminps_avx512f(auVar113,auVar37);
          auVar36._8_4_ = -88.37626;
          auVar36._12_4_ = -88.37626;
          auVar36._0_4_ = -88.37626;
          auVar36._4_4_ = -88.37626;
          auVar36._16_4_ = -88.37626;
          auVar36._20_4_ = -88.37626;
          auVar36._24_4_ = -88.37626;
          auVar36._28_4_ = -88.37626;
          auVar36._32_4_ = -88.37626;
          auVar36._36_4_ = -88.37626;
          auVar36._40_4_ = -88.37626;
          auVar36._44_4_ = -88.37626;
          auVar36._48_4_ = -88.37626;
          auVar36._52_4_ = -88.37626;
          auVar36._56_4_ = -88.37626;
          auVar36._60_4_ = -88.37626;
          auVar118 = vmaxps_avx512f(auVar113,auVar36);
          auVar35._8_4_ = 1.442695;
          auVar35._12_4_ = 1.442695;
          auVar35._0_4_ = 1.442695;
          auVar35._4_4_ = 1.442695;
          auVar35._16_4_ = 1.442695;
          auVar35._20_4_ = 1.442695;
          auVar35._24_4_ = 1.442695;
          auVar35._28_4_ = 1.442695;
          auVar35._32_4_ = 1.442695;
          auVar35._36_4_ = 1.442695;
          auVar35._40_4_ = 1.442695;
          auVar35._44_4_ = 1.442695;
          auVar35._48_4_ = 1.442695;
          auVar35._52_4_ = 1.442695;
          auVar35._56_4_ = 1.442695;
          auVar35._60_4_ = 1.442695;
          auVar34._8_4_ = 0.5;
          auVar34._12_4_ = 0.5;
          auVar34._0_4_ = 0.5;
          auVar34._4_4_ = 0.5;
          auVar34._16_4_ = 0.5;
          auVar34._20_4_ = 0.5;
          auVar34._24_4_ = 0.5;
          auVar34._28_4_ = 0.5;
          auVar34._32_4_ = 0.5;
          auVar34._36_4_ = 0.5;
          auVar34._40_4_ = 0.5;
          auVar34._44_4_ = 0.5;
          auVar34._48_4_ = 0.5;
          auVar34._52_4_ = 0.5;
          auVar34._56_4_ = 0.5;
          auVar34._60_4_ = 0.5;
          auVar113 = vfmadd213ps_avx512f(auVar35,auVar118,auVar34);
          auVar115 = vrndscaleps_avx512f(auVar113,1);
          uVar19 = vcmpps_avx512f(auVar113,auVar115,1);
          uVar21 = (ushort)uVar19;
          auVar38._8_4_ = 1.0;
          auVar38._12_4_ = 1.0;
          auVar38._0_4_ = 1.0;
          auVar38._4_4_ = 1.0;
          auVar38._16_4_ = 1.0;
          auVar38._20_4_ = 1.0;
          auVar38._24_4_ = 1.0;
          auVar38._28_4_ = 1.0;
          auVar38._32_4_ = 1.0;
          auVar38._36_4_ = 1.0;
          auVar38._40_4_ = 1.0;
          auVar38._44_4_ = 1.0;
          auVar38._48_4_ = 1.0;
          auVar38._52_4_ = 1.0;
          auVar38._56_4_ = 1.0;
          auVar38._60_4_ = 1.0;
          local_3240 = auVar115._0_4_;
          iStack_323c = auVar115._4_4_;
          iStack_3238 = auVar115._8_4_;
          iStack_3234 = auVar115._12_4_;
          iStack_3230 = auVar115._16_4_;
          iStack_322c = auVar115._20_4_;
          iStack_3228 = auVar115._24_4_;
          iStack_3224 = auVar115._28_4_;
          iStack_3220 = auVar115._32_4_;
          iStack_321c = auVar115._36_4_;
          iStack_3218 = auVar115._40_4_;
          iStack_3214 = auVar115._44_4_;
          iStack_3210 = auVar115._48_4_;
          iStack_320c = auVar115._52_4_;
          iStack_3208 = auVar115._56_4_;
          iStack_3204 = auVar115._60_4_;
          auVar113 = vsubps_avx512f(auVar115,auVar38);
          bVar4 = (bool)((byte)uVar19 & 1);
          bVar5 = (bool)((byte)(uVar21 >> 1) & 1);
          bVar6 = (bool)((byte)(uVar21 >> 2) & 1);
          bVar7 = (bool)((byte)(uVar21 >> 3) & 1);
          bVar8 = (bool)((byte)(uVar21 >> 4) & 1);
          bVar9 = (bool)((byte)(uVar21 >> 5) & 1);
          bVar10 = (bool)((byte)(uVar21 >> 6) & 1);
          bVar11 = (bool)((byte)(uVar21 >> 7) & 1);
          bVar12 = (byte)((ulong)uVar19 >> 8);
          bVar13 = (bool)(bVar12 >> 1 & 1);
          bVar14 = (bool)(bVar12 >> 2 & 1);
          bVar15 = (bool)(bVar12 >> 3 & 1);
          bVar16 = (bool)(bVar12 >> 4 & 1);
          bVar17 = (bool)(bVar12 >> 5 & 1);
          bVar18 = (bool)(bVar12 >> 6 & 1);
          local_3c40._4_4_ = (uint)bVar5 * auVar113._4_4_ | (uint)!bVar5 * iStack_323c;
          local_3c40._0_4_ = (uint)bVar4 * auVar113._0_4_ | (uint)!bVar4 * local_3240;
          local_3c40._8_4_ = (uint)bVar6 * auVar113._8_4_ | (uint)!bVar6 * iStack_3238;
          local_3c40._12_4_ = (uint)bVar7 * auVar113._12_4_ | (uint)!bVar7 * iStack_3234;
          uStack_3c30._0_4_ = (uint)bVar8 * auVar113._16_4_ | (uint)!bVar8 * iStack_3230;
          uStack_3c30._4_4_ = (uint)bVar9 * auVar113._20_4_ | (uint)!bVar9 * iStack_322c;
          uStack_3c28._0_4_ = (uint)bVar10 * auVar113._24_4_ | (uint)!bVar10 * iStack_3228;
          uStack_3c28._4_4_ = (uint)bVar11 * auVar113._28_4_ | (uint)!bVar11 * iStack_3224;
          auVar103 = _local_3c40;
          uStack_3c20._0_4_ =
               (uint)(bVar12 & 1) * auVar113._32_4_ | (uint)!(bool)(bVar12 & 1) * iStack_3220;
          uStack_3c20._4_4_ = (uint)bVar13 * auVar113._36_4_ | (uint)!bVar13 * iStack_321c;
          auVar104 = _local_3c40;
          uStack_3c18._0_4_ = (uint)bVar14 * auVar113._40_4_ | (uint)!bVar14 * iStack_3218;
          uStack_3c18._4_4_ = (uint)bVar15 * auVar113._44_4_ | (uint)!bVar15 * iStack_3214;
          auVar105 = _local_3c40;
          uStack_3c10._0_4_ = (uint)bVar16 * auVar113._48_4_ | (uint)!bVar16 * iStack_3210;
          uStack_3c10._4_4_ = (uint)bVar17 * auVar113._52_4_ | (uint)!bVar17 * iStack_320c;
          auVar106 = _local_3c40;
          uStack_3c08._0_4_ = (uint)bVar18 * auVar113._56_4_ | (uint)!bVar18 * iStack_3208;
          uStack_3c08._4_4_ =
               (uint)(bVar12 >> 7) * auVar113._60_4_ | (uint)!(bool)(bVar12 >> 7) * iStack_3204;
          auVar113 = _local_3c40;
          uStack_3c28 = auVar103._24_8_;
          uStack_3c20 = auVar104._32_8_;
          uStack_3c18 = auVar105._40_8_;
          uStack_3c10 = auVar106._48_8_;
          uStack_3c08 = auVar113._56_8_;
          auVar43._16_8_ = uStack_3c30;
          auVar43._0_16_ = local_3c40;
          auVar43._24_8_ = uStack_3c28;
          auVar43._32_8_ = uStack_3c20;
          auVar43._40_8_ = uStack_3c18;
          auVar43._48_8_ = uStack_3c10;
          auVar43._56_8_ = uStack_3c08;
          auVar42._8_4_ = 0.6933594;
          auVar42._12_4_ = 0.6933594;
          auVar42._0_4_ = 0.6933594;
          auVar42._4_4_ = 0.6933594;
          auVar42._16_4_ = 0.6933594;
          auVar42._20_4_ = 0.6933594;
          auVar42._24_4_ = 0.6933594;
          auVar42._28_4_ = 0.6933594;
          auVar42._32_4_ = 0.6933594;
          auVar42._36_4_ = 0.6933594;
          auVar42._40_4_ = 0.6933594;
          auVar42._44_4_ = 0.6933594;
          auVar42._48_4_ = 0.6933594;
          auVar42._52_4_ = 0.6933594;
          auVar42._56_4_ = 0.6933594;
          auVar42._60_4_ = 0.6933594;
          auVar113 = vfnmadd213ps_avx512f(auVar42,auVar43,auVar118);
          auVar41._16_8_ = uStack_3c30;
          auVar41._0_16_ = local_3c40;
          auVar41._24_8_ = uStack_3c28;
          auVar41._32_8_ = uStack_3c20;
          auVar41._40_8_ = uStack_3c18;
          auVar41._48_8_ = uStack_3c10;
          auVar41._56_8_ = uStack_3c08;
          auVar40._8_4_ = -0.00021219444;
          auVar40._12_4_ = -0.00021219444;
          auVar40._0_4_ = -0.00021219444;
          auVar40._4_4_ = -0.00021219444;
          auVar40._16_4_ = -0.00021219444;
          auVar40._20_4_ = -0.00021219444;
          auVar40._24_4_ = -0.00021219444;
          auVar40._28_4_ = -0.00021219444;
          auVar40._32_4_ = -0.00021219444;
          auVar40._36_4_ = -0.00021219444;
          auVar40._40_4_ = -0.00021219444;
          auVar40._44_4_ = -0.00021219444;
          auVar40._48_4_ = -0.00021219444;
          auVar40._52_4_ = -0.00021219444;
          auVar40._56_4_ = -0.00021219444;
          auVar40._60_4_ = -0.00021219444;
          auVar113 = vfnmadd213ps_avx512f(auVar40,auVar41,auVar113);
          auVar118 = vmulps_avx512f(auVar113,auVar113);
          local_3d40._8_4_ = 0.00019875691;
          local_3d40._12_4_ = 0.00019875691;
          local_3d40._0_4_ = 0.00019875691;
          local_3d40._4_4_ = 0.00019875691;
          auVar33._16_4_ = 0.00019875691;
          auVar33._20_4_ = 0.00019875691;
          auVar33._0_16_ = local_3d40._0_16_;
          auVar33._24_4_ = 0.00019875691;
          auVar33._28_4_ = 0.00019875691;
          auVar33._32_4_ = 0.00019875691;
          auVar33._36_4_ = 0.00019875691;
          auVar33._40_4_ = 0.00019875691;
          auVar33._44_4_ = 0.00019875691;
          auVar33._48_4_ = 0.00019875691;
          auVar33._52_4_ = 0.00019875691;
          auVar33._56_4_ = 0.00019875691;
          auVar33._60_4_ = 0.00019875691;
          auVar32._8_4_ = 0.0013981999;
          auVar32._12_4_ = 0.0013981999;
          auVar32._0_4_ = 0.0013981999;
          auVar32._4_4_ = 0.0013981999;
          auVar32._16_4_ = 0.0013981999;
          auVar32._20_4_ = 0.0013981999;
          auVar32._24_4_ = 0.0013981999;
          auVar32._28_4_ = 0.0013981999;
          auVar32._32_4_ = 0.0013981999;
          auVar32._36_4_ = 0.0013981999;
          auVar32._40_4_ = 0.0013981999;
          auVar32._44_4_ = 0.0013981999;
          auVar32._48_4_ = 0.0013981999;
          auVar32._52_4_ = 0.0013981999;
          auVar32._56_4_ = 0.0013981999;
          auVar32._60_4_ = 0.0013981999;
          auVar115 = vfmadd213ps_avx512f(auVar113,auVar33,auVar32);
          auVar31._8_4_ = 0.008333452;
          auVar31._12_4_ = 0.008333452;
          auVar31._0_4_ = 0.008333452;
          auVar31._4_4_ = 0.008333452;
          auVar31._16_4_ = 0.008333452;
          auVar31._20_4_ = 0.008333452;
          auVar31._24_4_ = 0.008333452;
          auVar31._28_4_ = 0.008333452;
          auVar31._32_4_ = 0.008333452;
          auVar31._36_4_ = 0.008333452;
          auVar31._40_4_ = 0.008333452;
          auVar31._44_4_ = 0.008333452;
          auVar31._48_4_ = 0.008333452;
          auVar31._52_4_ = 0.008333452;
          auVar31._56_4_ = 0.008333452;
          auVar31._60_4_ = 0.008333452;
          auVar115 = vfmadd213ps_avx512f(auVar113,auVar115,auVar31);
          auVar30._8_4_ = 0.041665796;
          auVar30._12_4_ = 0.041665796;
          auVar30._0_4_ = 0.041665796;
          auVar30._4_4_ = 0.041665796;
          auVar30._16_4_ = 0.041665796;
          auVar30._20_4_ = 0.041665796;
          auVar30._24_4_ = 0.041665796;
          auVar30._28_4_ = 0.041665796;
          auVar30._32_4_ = 0.041665796;
          auVar30._36_4_ = 0.041665796;
          auVar30._40_4_ = 0.041665796;
          auVar30._44_4_ = 0.041665796;
          auVar30._48_4_ = 0.041665796;
          auVar30._52_4_ = 0.041665796;
          auVar30._56_4_ = 0.041665796;
          auVar30._60_4_ = 0.041665796;
          auVar115 = vfmadd213ps_avx512f(auVar113,auVar115,auVar30);
          auVar29._8_4_ = 0.16666666;
          auVar29._12_4_ = 0.16666666;
          auVar29._0_4_ = 0.16666666;
          auVar29._4_4_ = 0.16666666;
          auVar29._16_4_ = 0.16666666;
          auVar29._20_4_ = 0.16666666;
          auVar29._24_4_ = 0.16666666;
          auVar29._28_4_ = 0.16666666;
          auVar29._32_4_ = 0.16666666;
          auVar29._36_4_ = 0.16666666;
          auVar29._40_4_ = 0.16666666;
          auVar29._44_4_ = 0.16666666;
          auVar29._48_4_ = 0.16666666;
          auVar29._52_4_ = 0.16666666;
          auVar29._56_4_ = 0.16666666;
          auVar29._60_4_ = 0.16666666;
          auVar115 = vfmadd213ps_avx512f(auVar113,auVar115,auVar29);
          auVar28._8_4_ = 0.5;
          auVar28._12_4_ = 0.5;
          auVar28._0_4_ = 0.5;
          auVar28._4_4_ = 0.5;
          auVar28._16_4_ = 0.5;
          auVar28._20_4_ = 0.5;
          auVar28._24_4_ = 0.5;
          auVar28._28_4_ = 0.5;
          auVar28._32_4_ = 0.5;
          auVar28._36_4_ = 0.5;
          auVar28._40_4_ = 0.5;
          auVar28._44_4_ = 0.5;
          auVar28._48_4_ = 0.5;
          auVar28._52_4_ = 0.5;
          auVar28._56_4_ = 0.5;
          auVar28._60_4_ = 0.5;
          auVar115 = vfmadd213ps_avx512f(auVar113,auVar115,auVar28);
          auVar113 = vfmadd213ps_avx512f(auVar118,auVar115,auVar113);
          auVar27._8_4_ = 1.0;
          auVar27._12_4_ = 1.0;
          auVar27._0_4_ = 1.0;
          auVar27._4_4_ = 1.0;
          auVar27._16_4_ = 1.0;
          auVar27._20_4_ = 1.0;
          auVar27._24_4_ = 1.0;
          auVar27._28_4_ = 1.0;
          auVar27._32_4_ = 1.0;
          auVar27._36_4_ = 1.0;
          auVar27._40_4_ = 1.0;
          auVar27._44_4_ = 1.0;
          auVar27._48_4_ = 1.0;
          auVar27._52_4_ = 1.0;
          auVar27._56_4_ = 1.0;
          auVar27._60_4_ = 1.0;
          auVar115 = vaddps_avx512f(auVar113,auVar27);
          auVar48._16_8_ = uStack_3c30;
          auVar48._0_16_ = local_3c40;
          auVar48._24_8_ = uStack_3c28;
          auVar48._32_8_ = uStack_3c20;
          auVar48._40_8_ = uStack_3c18;
          auVar48._48_8_ = uStack_3c10;
          auVar48._56_8_ = uStack_3c08;
          auVar113 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
          vmovdqa64_avx512f(auVar113);
          auVar113 = vcvttps2dq_avx512f(auVar48);
          auVar113 = vmovdqa64_avx512f(auVar113);
          auVar113 = vmovdqa64_avx512f(auVar113);
          auVar118 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
          auVar113 = vmovdqa64_avx512f(auVar113);
          auVar118 = vmovdqa64_avx512f(auVar118);
          auVar113 = vmovdqa64_avx512f(auVar113);
          auVar118 = vmovdqa64_avx512f(auVar118);
          auVar113 = vpaddd_avx512f(auVar113,auVar118);
          auVar113 = vmovdqa64_avx512f(auVar113);
          auVar113 = vmovdqa64_avx512f(auVar113);
          auVar113 = vmovdqa64_avx512f(auVar113);
          auVar113 = vmovdqa64_avx512f(auVar113);
          auVar113 = vpslld_avx512f(auVar113,ZEXT416(0x17));
          auVar113 = vmovdqa64_avx512f(auVar113);
          auVar113 = vmovdqa64_avx512f(auVar113);
          auVar113 = vmovdqa64_avx512f(auVar113);
          auVar113 = vmovdqa64_avx512f(auVar113);
          auVar113 = vmulps_avx512f(auVar115,auVar113);
          auVar113 = vaddps_avx512f(auVar119,auVar113);
          local_56c0 = vdivps_avx512f(auVar119,auVar113);
          break;
        case 5:
          auVar26._8_4_ = 88.37626;
          auVar26._12_4_ = 88.37626;
          auVar26._0_4_ = 88.37626;
          auVar26._4_4_ = 88.37626;
          auVar26._16_4_ = 88.37626;
          auVar26._20_4_ = 88.37626;
          auVar26._24_4_ = 88.37626;
          auVar26._28_4_ = 88.37626;
          auVar26._32_4_ = 88.37626;
          auVar26._36_4_ = 88.37626;
          auVar26._40_4_ = 88.37626;
          auVar26._44_4_ = 88.37626;
          auVar26._48_4_ = 88.37626;
          auVar26._52_4_ = 88.37626;
          auVar26._56_4_ = 88.37626;
          auVar26._60_4_ = 88.37626;
          auVar113 = vminps_avx512f(local_5e00,auVar26);
          auVar25._8_4_ = -88.37626;
          auVar25._12_4_ = -88.37626;
          auVar25._0_4_ = -88.37626;
          auVar25._4_4_ = -88.37626;
          auVar25._16_4_ = -88.37626;
          auVar25._20_4_ = -88.37626;
          auVar25._24_4_ = -88.37626;
          auVar25._28_4_ = -88.37626;
          auVar25._32_4_ = -88.37626;
          auVar25._36_4_ = -88.37626;
          auVar25._40_4_ = -88.37626;
          auVar25._44_4_ = -88.37626;
          auVar25._48_4_ = -88.37626;
          auVar25._52_4_ = -88.37626;
          auVar25._56_4_ = -88.37626;
          auVar25._60_4_ = -88.37626;
          auVar118 = vmaxps_avx512f(auVar113,auVar25);
          auVar24._8_4_ = 1.442695;
          auVar24._12_4_ = 1.442695;
          auVar24._0_4_ = 1.442695;
          auVar24._4_4_ = 1.442695;
          auVar24._16_4_ = 1.442695;
          auVar24._20_4_ = 1.442695;
          auVar24._24_4_ = 1.442695;
          auVar24._28_4_ = 1.442695;
          auVar24._32_4_ = 1.442695;
          auVar24._36_4_ = 1.442695;
          auVar24._40_4_ = 1.442695;
          auVar24._44_4_ = 1.442695;
          auVar24._48_4_ = 1.442695;
          auVar24._52_4_ = 1.442695;
          auVar24._56_4_ = 1.442695;
          auVar24._60_4_ = 1.442695;
          auVar114._8_4_ = 0.5;
          auVar114._12_4_ = 0.5;
          auVar114._0_4_ = 0.5;
          auVar114._4_4_ = 0.5;
          auVar114._16_4_ = 0.5;
          auVar114._20_4_ = 0.5;
          auVar114._24_4_ = 0.5;
          auVar114._28_4_ = 0.5;
          auVar114._32_4_ = 0.5;
          auVar114._36_4_ = 0.5;
          auVar114._40_4_ = 0.5;
          auVar114._44_4_ = 0.5;
          auVar114._48_4_ = 0.5;
          auVar114._52_4_ = 0.5;
          auVar114._56_4_ = 0.5;
          auVar114._60_4_ = 0.5;
          auVar113 = vfmadd213ps_avx512f(auVar24,auVar118,auVar114);
          auVar119 = vrndscaleps_avx512f(auVar113,1);
          uVar19 = vcmpps_avx512f(auVar113,auVar119,1);
          uVar21 = (ushort)uVar19;
          auVar39._8_4_ = 1.0;
          auVar39._12_4_ = 1.0;
          auVar39._0_4_ = 1.0;
          auVar39._4_4_ = 1.0;
          auVar39._16_4_ = 1.0;
          auVar39._20_4_ = 1.0;
          auVar39._24_4_ = 1.0;
          auVar39._28_4_ = 1.0;
          auVar39._32_4_ = 1.0;
          auVar39._36_4_ = 1.0;
          auVar39._40_4_ = 1.0;
          auVar39._44_4_ = 1.0;
          auVar39._48_4_ = 1.0;
          auVar39._52_4_ = 1.0;
          auVar39._56_4_ = 1.0;
          auVar39._60_4_ = 1.0;
          local_30c0 = auVar119._0_4_;
          iStack_30bc = auVar119._4_4_;
          iStack_30b8 = auVar119._8_4_;
          iStack_30b4 = auVar119._12_4_;
          iStack_30b0 = auVar119._16_4_;
          iStack_30ac = auVar119._20_4_;
          iStack_30a8 = auVar119._24_4_;
          iStack_30a4 = auVar119._28_4_;
          iStack_30a0 = auVar119._32_4_;
          iStack_309c = auVar119._36_4_;
          iStack_3098 = auVar119._40_4_;
          iStack_3094 = auVar119._44_4_;
          iStack_3090 = auVar119._48_4_;
          iStack_308c = auVar119._52_4_;
          iStack_3088 = auVar119._56_4_;
          iStack_3084 = auVar119._60_4_;
          auVar113 = vsubps_avx512f(auVar119,auVar39);
          bVar4 = (bool)((byte)uVar19 & 1);
          bVar5 = (bool)((byte)(uVar21 >> 1) & 1);
          bVar6 = (bool)((byte)(uVar21 >> 2) & 1);
          bVar7 = (bool)((byte)(uVar21 >> 3) & 1);
          bVar8 = (bool)((byte)(uVar21 >> 4) & 1);
          bVar9 = (bool)((byte)(uVar21 >> 5) & 1);
          bVar10 = (bool)((byte)(uVar21 >> 6) & 1);
          bVar11 = (bool)((byte)(uVar21 >> 7) & 1);
          bVar12 = (byte)((ulong)uVar19 >> 8);
          bVar13 = (bool)(bVar12 >> 1 & 1);
          bVar14 = (bool)(bVar12 >> 2 & 1);
          bVar15 = (bool)(bVar12 >> 3 & 1);
          bVar16 = (bool)(bVar12 >> 4 & 1);
          bVar17 = (bool)(bVar12 >> 5 & 1);
          bVar18 = (bool)(bVar12 >> 6 & 1);
          local_4640._4_4_ = (uint)bVar5 * auVar113._4_4_ | (uint)!bVar5 * iStack_30bc;
          local_4640._0_4_ = (uint)bVar4 * auVar113._0_4_ | (uint)!bVar4 * local_30c0;
          local_4640._8_4_ = (uint)bVar6 * auVar113._8_4_ | (uint)!bVar6 * iStack_30b8;
          local_4640._12_4_ = (uint)bVar7 * auVar113._12_4_ | (uint)!bVar7 * iStack_30b4;
          uStack_4630._0_4_ = (uint)bVar8 * auVar113._16_4_ | (uint)!bVar8 * iStack_30b0;
          uStack_4630._4_4_ = (uint)bVar9 * auVar113._20_4_ | (uint)!bVar9 * iStack_30ac;
          uStack_4628._0_4_ = (uint)bVar10 * auVar113._24_4_ | (uint)!bVar10 * iStack_30a8;
          uStack_4628._4_4_ = (uint)bVar11 * auVar113._28_4_ | (uint)!bVar11 * iStack_30a4;
          auVar103 = _local_4640;
          uStack_4620._0_4_ =
               (uint)(bVar12 & 1) * auVar113._32_4_ | (uint)!(bool)(bVar12 & 1) * iStack_30a0;
          uStack_4620._4_4_ = (uint)bVar13 * auVar113._36_4_ | (uint)!bVar13 * iStack_309c;
          auVar104 = _local_4640;
          uStack_4618._0_4_ = (uint)bVar14 * auVar113._40_4_ | (uint)!bVar14 * iStack_3098;
          uStack_4618._4_4_ = (uint)bVar15 * auVar113._44_4_ | (uint)!bVar15 * iStack_3094;
          auVar105 = _local_4640;
          uStack_4610._0_4_ = (uint)bVar16 * auVar113._48_4_ | (uint)!bVar16 * iStack_3090;
          uStack_4610._4_4_ = (uint)bVar17 * auVar113._52_4_ | (uint)!bVar17 * iStack_308c;
          auVar106 = _local_4640;
          uStack_4608._0_4_ = (uint)bVar18 * auVar113._56_4_ | (uint)!bVar18 * iStack_3088;
          uStack_4608._4_4_ =
               (uint)(bVar12 >> 7) * auVar113._60_4_ | (uint)!(bool)(bVar12 >> 7) * iStack_3084;
          auVar113 = _local_4640;
          uStack_4628 = auVar103._24_8_;
          uStack_4620 = auVar104._32_8_;
          uStack_4618 = auVar105._40_8_;
          uStack_4610 = auVar106._48_8_;
          uStack_4608 = auVar113._56_8_;
          auVar47._16_8_ = uStack_4630;
          auVar47._0_16_ = local_4640;
          auVar47._24_8_ = uStack_4628;
          auVar47._32_8_ = uStack_4620;
          auVar47._40_8_ = uStack_4618;
          auVar47._48_8_ = uStack_4610;
          auVar47._56_8_ = uStack_4608;
          auVar46._8_4_ = 0.6933594;
          auVar46._12_4_ = 0.6933594;
          auVar46._0_4_ = 0.6933594;
          auVar46._4_4_ = 0.6933594;
          auVar46._16_4_ = 0.6933594;
          auVar46._20_4_ = 0.6933594;
          auVar46._24_4_ = 0.6933594;
          auVar46._28_4_ = 0.6933594;
          auVar46._32_4_ = 0.6933594;
          auVar46._36_4_ = 0.6933594;
          auVar46._40_4_ = 0.6933594;
          auVar46._44_4_ = 0.6933594;
          auVar46._48_4_ = 0.6933594;
          auVar46._52_4_ = 0.6933594;
          auVar46._56_4_ = 0.6933594;
          auVar46._60_4_ = 0.6933594;
          auVar113 = vfnmadd213ps_avx512f(auVar46,auVar47,auVar118);
          auVar45._16_8_ = uStack_4630;
          auVar45._0_16_ = local_4640;
          auVar45._24_8_ = uStack_4628;
          auVar45._32_8_ = uStack_4620;
          auVar45._40_8_ = uStack_4618;
          auVar45._48_8_ = uStack_4610;
          auVar45._56_8_ = uStack_4608;
          auVar44._8_4_ = -0.00021219444;
          auVar44._12_4_ = -0.00021219444;
          auVar44._0_4_ = -0.00021219444;
          auVar44._4_4_ = -0.00021219444;
          auVar44._16_4_ = -0.00021219444;
          auVar44._20_4_ = -0.00021219444;
          auVar44._24_4_ = -0.00021219444;
          auVar44._28_4_ = -0.00021219444;
          auVar44._32_4_ = -0.00021219444;
          auVar44._36_4_ = -0.00021219444;
          auVar44._40_4_ = -0.00021219444;
          auVar44._44_4_ = -0.00021219444;
          auVar44._48_4_ = -0.00021219444;
          auVar44._52_4_ = -0.00021219444;
          auVar44._56_4_ = -0.00021219444;
          auVar44._60_4_ = -0.00021219444;
          auVar113 = vfnmadd213ps_avx512f(auVar44,auVar45,auVar113);
          auVar114 = vmulps_avx512f(auVar113,auVar113);
          local_4740._8_4_ = 0.00019875691;
          local_4740._12_4_ = 0.00019875691;
          local_4740._0_4_ = 0.00019875691;
          local_4740._4_4_ = 0.00019875691;
          auVar23._16_4_ = 0.00019875691;
          auVar23._20_4_ = 0.00019875691;
          auVar23._0_16_ = local_4740._0_16_;
          auVar23._24_4_ = 0.00019875691;
          auVar23._28_4_ = 0.00019875691;
          auVar23._32_4_ = 0.00019875691;
          auVar23._36_4_ = 0.00019875691;
          auVar23._40_4_ = 0.00019875691;
          auVar23._44_4_ = 0.00019875691;
          auVar23._48_4_ = 0.00019875691;
          auVar23._52_4_ = 0.00019875691;
          auVar23._56_4_ = 0.00019875691;
          auVar23._60_4_ = 0.00019875691;
          auVar117._8_4_ = 0.0013981999;
          auVar117._12_4_ = 0.0013981999;
          auVar117._0_4_ = 0.0013981999;
          auVar117._4_4_ = 0.0013981999;
          auVar117._16_4_ = 0.0013981999;
          auVar117._20_4_ = 0.0013981999;
          auVar117._24_4_ = 0.0013981999;
          auVar117._28_4_ = 0.0013981999;
          auVar117._32_4_ = 0.0013981999;
          auVar117._36_4_ = 0.0013981999;
          auVar117._40_4_ = 0.0013981999;
          auVar117._44_4_ = 0.0013981999;
          auVar117._48_4_ = 0.0013981999;
          auVar117._52_4_ = 0.0013981999;
          auVar117._56_4_ = 0.0013981999;
          auVar117._60_4_ = 0.0013981999;
          auVar118 = vfmadd213ps_avx512f(auVar113,auVar23,auVar117);
          auVar116._8_4_ = 0.008333452;
          auVar116._12_4_ = 0.008333452;
          auVar116._0_4_ = 0.008333452;
          auVar116._4_4_ = 0.008333452;
          auVar116._16_4_ = 0.008333452;
          auVar116._20_4_ = 0.008333452;
          auVar116._24_4_ = 0.008333452;
          auVar116._28_4_ = 0.008333452;
          auVar116._32_4_ = 0.008333452;
          auVar116._36_4_ = 0.008333452;
          auVar116._40_4_ = 0.008333452;
          auVar116._44_4_ = 0.008333452;
          auVar116._48_4_ = 0.008333452;
          auVar116._52_4_ = 0.008333452;
          auVar116._56_4_ = 0.008333452;
          auVar116._60_4_ = 0.008333452;
          auVar118 = vfmadd213ps_avx512f(auVar113,auVar118,auVar116);
          auVar115._8_4_ = 0.041665796;
          auVar115._12_4_ = 0.041665796;
          auVar115._0_4_ = 0.041665796;
          auVar115._4_4_ = 0.041665796;
          auVar115._16_4_ = 0.041665796;
          auVar115._20_4_ = 0.041665796;
          auVar115._24_4_ = 0.041665796;
          auVar115._28_4_ = 0.041665796;
          auVar115._32_4_ = 0.041665796;
          auVar115._36_4_ = 0.041665796;
          auVar115._40_4_ = 0.041665796;
          auVar115._44_4_ = 0.041665796;
          auVar115._48_4_ = 0.041665796;
          auVar115._52_4_ = 0.041665796;
          auVar115._56_4_ = 0.041665796;
          auVar115._60_4_ = 0.041665796;
          auVar118 = vfmadd213ps_avx512f(auVar113,auVar118,auVar115);
          auVar119._8_4_ = 0.16666666;
          auVar119._12_4_ = 0.16666666;
          auVar119._0_4_ = 0.16666666;
          auVar119._4_4_ = 0.16666666;
          auVar119._16_4_ = 0.16666666;
          auVar119._20_4_ = 0.16666666;
          auVar119._24_4_ = 0.16666666;
          auVar119._28_4_ = 0.16666666;
          auVar119._32_4_ = 0.16666666;
          auVar119._36_4_ = 0.16666666;
          auVar119._40_4_ = 0.16666666;
          auVar119._44_4_ = 0.16666666;
          auVar119._48_4_ = 0.16666666;
          auVar119._52_4_ = 0.16666666;
          auVar119._56_4_ = 0.16666666;
          auVar119._60_4_ = 0.16666666;
          auVar119 = vfmadd213ps_avx512f(auVar113,auVar118,auVar119);
          auVar118._8_4_ = 0.5;
          auVar118._12_4_ = 0.5;
          auVar118._0_4_ = 0.5;
          auVar118._4_4_ = 0.5;
          auVar118._16_4_ = 0.5;
          auVar118._20_4_ = 0.5;
          auVar118._24_4_ = 0.5;
          auVar118._28_4_ = 0.5;
          auVar118._32_4_ = 0.5;
          auVar118._36_4_ = 0.5;
          auVar118._40_4_ = 0.5;
          auVar118._44_4_ = 0.5;
          auVar118._48_4_ = 0.5;
          auVar118._52_4_ = 0.5;
          auVar118._56_4_ = 0.5;
          auVar118._60_4_ = 0.5;
          auVar118 = vfmadd213ps_avx512f(auVar113,auVar119,auVar118);
          auVar118 = vfmadd213ps_avx512f(auVar114,auVar118,auVar113);
          auVar113._8_4_ = 1.0;
          auVar113._12_4_ = 1.0;
          auVar113._0_4_ = 1.0;
          auVar113._4_4_ = 1.0;
          auVar113._16_4_ = 1.0;
          auVar113._20_4_ = 1.0;
          auVar113._24_4_ = 1.0;
          auVar113._28_4_ = 1.0;
          auVar113._32_4_ = 1.0;
          auVar113._36_4_ = 1.0;
          auVar113._40_4_ = 1.0;
          auVar113._44_4_ = 1.0;
          auVar113._48_4_ = 1.0;
          auVar113._52_4_ = 1.0;
          auVar113._56_4_ = 1.0;
          auVar113._60_4_ = 1.0;
          auVar119 = vaddps_avx512f(auVar118,auVar113);
          auVar49._16_8_ = uStack_4630;
          auVar49._0_16_ = local_4640;
          auVar49._24_8_ = uStack_4628;
          auVar49._32_8_ = uStack_4620;
          auVar49._40_8_ = uStack_4618;
          auVar49._48_8_ = uStack_4610;
          auVar49._56_8_ = uStack_4608;
          auVar113 = vcvttps2dq_avx512f(auVar49);
          vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
          auVar113 = vmovdqa64_avx512f(auVar113);
          auVar113 = vmovdqa64_avx512f(auVar113);
          auVar118 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
          auVar113 = vmovdqa64_avx512f(auVar113);
          auVar118 = vmovdqa64_avx512f(auVar118);
          auVar113 = vmovdqa64_avx512f(auVar113);
          auVar118 = vmovdqa64_avx512f(auVar118);
          auVar113 = vpaddd_avx512f(auVar113,auVar118);
          auVar113 = vmovdqa64_avx512f(auVar113);
          auVar113 = vmovdqa64_avx512f(auVar113);
          auVar113 = vmovdqa64_avx512f(auVar113);
          auVar113 = vmovdqa64_avx512f(auVar113);
          auVar113 = vpslld_avx512f(auVar113,ZEXT416(0x17));
          auVar113 = vmovdqa64_avx512f(auVar113);
          auVar113 = vmovdqa64_avx512f(auVar113);
          auVar113 = vmovdqa64_avx512f(auVar113);
          auVar113 = vmovdqa64_avx512f(auVar113);
          auVar113 = vmovdqa64_avx512f(auVar113);
          auVar113 = vmulps_avx512f(auVar119,auVar113);
          auVar118 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
          auVar113 = vaddps_avx512f(auVar113,auVar118);
          uVar20 = vcmpps_avx512f(auVar113,ZEXT1664(ZEXT816(0)),2);
          auVar90._8_4_ = 0x800000;
          auVar90._12_4_ = 0x800000;
          auVar90._0_4_ = 0x800000;
          auVar90._4_4_ = 0x800000;
          auVar90._16_4_ = 0x800000;
          auVar90._20_4_ = 0x800000;
          auVar90._24_4_ = 0x800000;
          auVar90._28_4_ = 0x800000;
          auVar90._32_4_ = 0x800000;
          auVar90._36_4_ = 0x800000;
          auVar90._40_4_ = 0x800000;
          auVar90._44_4_ = 0x800000;
          auVar90._48_4_ = 0x800000;
          auVar90._52_4_ = 0x800000;
          auVar90._56_4_ = 0x800000;
          auVar90._60_4_ = 0x800000;
          auVar118 = vmaxps_avx512f(auVar113,auVar90);
          auVar113 = vmovdqa64_avx512f(auVar118);
          auVar113 = vpsrld_avx512f(auVar113,ZEXT416(0x17));
          auVar113 = vmovdqa64_avx512f(auVar113);
          auVar118 = vmovdqa64_avx512f(auVar118);
          auVar97._8_4_ = -0x7f800001;
          auVar97._12_4_ = -0x7f800001;
          auVar97._0_4_ = -0x7f800001;
          auVar97._4_4_ = -0x7f800001;
          auVar97._16_4_ = -0x7f800001;
          auVar97._20_4_ = -0x7f800001;
          auVar97._24_4_ = -0x7f800001;
          auVar97._28_4_ = -0x7f800001;
          auVar97._32_4_ = -0x7f800001;
          auVar97._36_4_ = -0x7f800001;
          auVar97._40_4_ = -0x7f800001;
          auVar97._44_4_ = -0x7f800001;
          auVar97._48_4_ = -0x7f800001;
          auVar97._52_4_ = -0x7f800001;
          auVar97._56_4_ = -0x7f800001;
          auVar97._60_4_ = -0x7f800001;
          auVar119 = vmovdqa64_avx512f(auVar97);
          auVar118 = vpandd_avx512f(auVar118,auVar119);
          auVar118 = vmovdqa64_avx512f(auVar118);
          auVar118 = vmovdqa64_avx512f(auVar118);
          auVar98._8_4_ = 0.5;
          auVar98._12_4_ = 0.5;
          auVar98._0_4_ = 0.5;
          auVar98._4_4_ = 0.5;
          auVar98._16_4_ = 0.5;
          auVar98._20_4_ = 0.5;
          auVar98._24_4_ = 0.5;
          auVar98._28_4_ = 0.5;
          auVar98._32_4_ = 0.5;
          auVar98._36_4_ = 0.5;
          auVar98._40_4_ = 0.5;
          auVar98._44_4_ = 0.5;
          auVar98._48_4_ = 0.5;
          auVar98._52_4_ = 0.5;
          auVar98._56_4_ = 0.5;
          auVar98._60_4_ = 0.5;
          auVar119 = vmovdqa64_avx512f(auVar98);
          auVar118 = vpord_avx512f(auVar118,auVar119);
          auVar118 = vmovdqa64_avx512f(auVar118);
          auVar113 = vmovdqa64_avx512f(auVar113);
          auVar119 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
          auVar113 = vmovdqa64_avx512f(auVar113);
          auVar119 = vmovdqa64_avx512f(auVar119);
          auVar113 = vmovdqa64_avx512f(auVar113);
          auVar119 = vmovdqa64_avx512f(auVar119);
          auVar113 = vpsubd_avx512f(auVar113,auVar119);
          auVar113 = vmovdqa64_avx512f(auVar113);
          auVar113 = vmovdqa64_avx512f(auVar113);
          auVar113 = vmovdqa64_avx512f(auVar113);
          auVar113 = vcvtdq2ps_avx512f(auVar113);
          auVar68._8_4_ = 1.0;
          auVar68._12_4_ = 1.0;
          auVar68._0_4_ = 1.0;
          auVar68._4_4_ = 1.0;
          auVar68._16_4_ = 1.0;
          auVar68._20_4_ = 1.0;
          auVar68._24_4_ = 1.0;
          auVar68._28_4_ = 1.0;
          auVar68._32_4_ = 1.0;
          auVar68._36_4_ = 1.0;
          auVar68._40_4_ = 1.0;
          auVar68._44_4_ = 1.0;
          auVar68._48_4_ = 1.0;
          auVar68._52_4_ = 1.0;
          auVar68._56_4_ = 1.0;
          auVar68._60_4_ = 1.0;
          auVar113 = vaddps_avx512f(auVar113,auVar68);
          uVar19 = vcmpps_avx512f(auVar118,(undefined1  [64])_ps512_cephes_SQRTHF,1);
          uVar21 = (ushort)uVar19;
          auVar94._8_4_ = 1.0;
          auVar94._12_4_ = 1.0;
          auVar94._0_4_ = 1.0;
          auVar94._4_4_ = 1.0;
          auVar94._16_4_ = 1.0;
          auVar94._20_4_ = 1.0;
          auVar94._24_4_ = 1.0;
          auVar94._28_4_ = 1.0;
          auVar94._32_4_ = 1.0;
          auVar94._36_4_ = 1.0;
          auVar94._40_4_ = 1.0;
          auVar94._44_4_ = 1.0;
          auVar94._48_4_ = 1.0;
          auVar94._52_4_ = 1.0;
          auVar94._56_4_ = 1.0;
          auVar94._60_4_ = 1.0;
          auVar119 = vsubps_avx512f(auVar118,auVar94);
          auVar95._8_4_ = 1.0;
          auVar95._12_4_ = 1.0;
          auVar95._0_4_ = 1.0;
          auVar95._4_4_ = 1.0;
          auVar95._16_4_ = 1.0;
          auVar95._20_4_ = 1.0;
          auVar95._24_4_ = 1.0;
          auVar95._28_4_ = 1.0;
          auVar95._32_4_ = 1.0;
          auVar95._36_4_ = 1.0;
          auVar95._40_4_ = 1.0;
          auVar95._44_4_ = 1.0;
          auVar95._48_4_ = 1.0;
          auVar95._52_4_ = 1.0;
          auVar95._56_4_ = 1.0;
          auVar95._60_4_ = 1.0;
          local_780 = auVar113._0_4_;
          iStack_77c = auVar113._4_4_;
          iStack_778 = auVar113._8_4_;
          iStack_774 = auVar113._12_4_;
          iStack_770 = auVar113._16_4_;
          iStack_76c = auVar113._20_4_;
          iStack_768 = auVar113._24_4_;
          iStack_764 = auVar113._28_4_;
          iStack_760 = auVar113._32_4_;
          iStack_75c = auVar113._36_4_;
          iStack_758 = auVar113._40_4_;
          iStack_754 = auVar113._44_4_;
          iStack_750 = auVar113._48_4_;
          iStack_74c = auVar113._52_4_;
          iStack_748 = auVar113._56_4_;
          iStack_744 = auVar113._60_4_;
          auVar113 = vsubps_avx512f(auVar113,auVar95);
          bVar4 = (bool)((byte)uVar19 & 1);
          bVar5 = (bool)((byte)(uVar21 >> 1) & 1);
          bVar6 = (bool)((byte)(uVar21 >> 2) & 1);
          bVar7 = (bool)((byte)(uVar21 >> 3) & 1);
          bVar8 = (bool)((byte)(uVar21 >> 4) & 1);
          bVar9 = (bool)((byte)(uVar21 >> 5) & 1);
          bVar10 = (bool)((byte)(uVar21 >> 6) & 1);
          bVar11 = (bool)((byte)(uVar21 >> 7) & 1);
          bVar12 = (byte)((ulong)uVar19 >> 8);
          bVar13 = (bool)(bVar12 >> 1 & 1);
          bVar14 = (bool)(bVar12 >> 2 & 1);
          bVar15 = (bool)(bVar12 >> 3 & 1);
          bVar16 = (bool)(bVar12 >> 4 & 1);
          bVar17 = (bool)(bVar12 >> 5 & 1);
          bVar18 = (bool)(bVar12 >> 6 & 1);
          local_14c0._4_4_ = (uint)bVar5 * auVar113._4_4_ | (uint)!bVar5 * iStack_77c;
          local_14c0._0_4_ = (uint)bVar4 * auVar113._0_4_ | (uint)!bVar4 * local_780;
          local_14c0._8_4_ = (uint)bVar6 * auVar113._8_4_ | (uint)!bVar6 * iStack_778;
          local_14c0._12_4_ = (uint)bVar7 * auVar113._12_4_ | (uint)!bVar7 * iStack_774;
          uStack_14b0._0_4_ = (uint)bVar8 * auVar113._16_4_ | (uint)!bVar8 * iStack_770;
          uStack_14b0._4_4_ = (uint)bVar9 * auVar113._20_4_ | (uint)!bVar9 * iStack_76c;
          uStack_14a8._0_4_ = (uint)bVar10 * auVar113._24_4_ | (uint)!bVar10 * iStack_768;
          uStack_14a8._4_4_ = (uint)bVar11 * auVar113._28_4_ | (uint)!bVar11 * iStack_764;
          auVar103 = _local_14c0;
          uStack_14a0._0_4_ =
               (uint)(bVar12 & 1) * auVar113._32_4_ | (uint)!(bool)(bVar12 & 1) * iStack_760;
          uStack_14a0._4_4_ = (uint)bVar13 * auVar113._36_4_ | (uint)!bVar13 * iStack_75c;
          auVar104 = _local_14c0;
          uStack_1498._0_4_ = (uint)bVar14 * auVar113._40_4_ | (uint)!bVar14 * iStack_758;
          uStack_1498._4_4_ = (uint)bVar15 * auVar113._44_4_ | (uint)!bVar15 * iStack_754;
          auVar105 = _local_14c0;
          uStack_1490._0_4_ = (uint)bVar16 * auVar113._48_4_ | (uint)!bVar16 * iStack_750;
          uStack_1490._4_4_ = (uint)bVar17 * auVar113._52_4_ | (uint)!bVar17 * iStack_74c;
          auVar106 = _local_14c0;
          uStack_1488._0_4_ = (uint)bVar18 * auVar113._56_4_ | (uint)!bVar18 * iStack_748;
          uStack_1488._4_4_ =
               (uint)(bVar12 >> 7) * auVar113._60_4_ | (uint)!(bool)(bVar12 >> 7) * iStack_744;
          auVar113 = _local_14c0;
          local_140 = auVar119._0_4_;
          iStack_13c = auVar119._4_4_;
          iStack_138 = auVar119._8_4_;
          iStack_134 = auVar119._12_4_;
          iStack_130 = auVar119._16_4_;
          iStack_12c = auVar119._20_4_;
          iStack_128 = auVar119._24_4_;
          iStack_124 = auVar119._28_4_;
          iStack_120 = auVar119._32_4_;
          iStack_11c = auVar119._36_4_;
          iStack_118 = auVar119._40_4_;
          iStack_114 = auVar119._44_4_;
          iStack_110 = auVar119._48_4_;
          iStack_10c = auVar119._52_4_;
          iStack_108 = auVar119._56_4_;
          iStack_104 = auVar119._60_4_;
          auVar118 = vaddps_avx512f(auVar119,auVar118);
          bVar4 = (bool)((byte)uVar19 & 1);
          bVar5 = (bool)((byte)(uVar21 >> 1) & 1);
          bVar6 = (bool)((byte)(uVar21 >> 2) & 1);
          bVar7 = (bool)((byte)(uVar21 >> 3) & 1);
          bVar8 = (bool)((byte)(uVar21 >> 4) & 1);
          bVar9 = (bool)((byte)(uVar21 >> 5) & 1);
          bVar10 = (bool)((byte)(uVar21 >> 6) & 1);
          bVar11 = (bool)((byte)(uVar21 >> 7) & 1);
          bVar13 = (bool)(bVar12 >> 1 & 1);
          bVar14 = (bool)(bVar12 >> 2 & 1);
          bVar15 = (bool)(bVar12 >> 3 & 1);
          bVar16 = (bool)(bVar12 >> 4 & 1);
          bVar17 = (bool)(bVar12 >> 5 & 1);
          bVar18 = (bool)(bVar12 >> 6 & 1);
          local_13c0._4_4_ = (uint)bVar5 * auVar118._4_4_ | (uint)!bVar5 * iStack_13c;
          local_13c0._0_4_ = (uint)bVar4 * auVar118._0_4_ | (uint)!bVar4 * local_140;
          local_13c0._8_4_ = (uint)bVar6 * auVar118._8_4_ | (uint)!bVar6 * iStack_138;
          local_13c0._12_4_ = (uint)bVar7 * auVar118._12_4_ | (uint)!bVar7 * iStack_134;
          uStack_13b0._0_4_ = (uint)bVar8 * auVar118._16_4_ | (uint)!bVar8 * iStack_130;
          uStack_13b0._4_4_ = (uint)bVar9 * auVar118._20_4_ | (uint)!bVar9 * iStack_12c;
          uStack_13a8._0_4_ = (uint)bVar10 * auVar118._24_4_ | (uint)!bVar10 * iStack_128;
          uStack_13a8._4_4_ = (uint)bVar11 * auVar118._28_4_ | (uint)!bVar11 * iStack_124;
          auVar107 = _local_13c0;
          uStack_13a0._0_4_ =
               (uint)(bVar12 & 1) * auVar118._32_4_ | (uint)!(bool)(bVar12 & 1) * iStack_120;
          uStack_13a0._4_4_ = (uint)bVar13 * auVar118._36_4_ | (uint)!bVar13 * iStack_11c;
          auVar108 = _local_13c0;
          uStack_1398._0_4_ = (uint)bVar14 * auVar118._40_4_ | (uint)!bVar14 * iStack_118;
          uStack_1398._4_4_ = (uint)bVar15 * auVar118._44_4_ | (uint)!bVar15 * iStack_114;
          auVar109 = _local_13c0;
          uStack_1390._0_4_ = (uint)bVar16 * auVar118._48_4_ | (uint)!bVar16 * iStack_110;
          uStack_1390._4_4_ = (uint)bVar17 * auVar118._52_4_ | (uint)!bVar17 * iStack_10c;
          auVar110 = _local_13c0;
          uStack_1388._0_4_ = (uint)bVar18 * auVar118._56_4_ | (uint)!bVar18 * iStack_108;
          uStack_1388._4_4_ =
               (uint)(bVar12 >> 7) * auVar118._60_4_ | (uint)!(bool)(bVar12 >> 7) * iStack_104;
          auVar118 = _local_13c0;
          uStack_13a8 = auVar107._24_8_;
          uStack_13a0 = auVar108._32_8_;
          uStack_1398 = auVar109._40_8_;
          uStack_1390 = auVar110._48_8_;
          uStack_1388 = auVar118._56_8_;
          auVar93._16_8_ = uStack_13b0;
          auVar93._0_16_ = local_13c0;
          auVar93._24_8_ = uStack_13a8;
          auVar93._32_8_ = uStack_13a0;
          auVar93._40_8_ = uStack_1398;
          auVar93._48_8_ = uStack_1390;
          auVar93._56_8_ = uStack_1388;
          auVar92._16_8_ = uStack_13b0;
          auVar92._0_16_ = local_13c0;
          auVar92._24_8_ = uStack_13a8;
          auVar92._32_8_ = uStack_13a0;
          auVar92._40_8_ = uStack_1398;
          auVar92._48_8_ = uStack_1390;
          auVar92._56_8_ = uStack_1388;
          auVar118 = vmulps_avx512f(auVar93,auVar92);
          local_15c0._8_4_ = 0.070376836;
          local_15c0._12_4_ = 0.070376836;
          local_15c0._0_4_ = 0.070376836;
          local_15c0._4_4_ = 0.070376836;
          auVar89._16_4_ = 0.070376836;
          auVar89._20_4_ = 0.070376836;
          auVar89._0_16_ = local_15c0._0_16_;
          auVar89._24_4_ = 0.070376836;
          auVar89._28_4_ = 0.070376836;
          auVar89._32_4_ = 0.070376836;
          auVar89._36_4_ = 0.070376836;
          auVar89._40_4_ = 0.070376836;
          auVar89._44_4_ = 0.070376836;
          auVar89._48_4_ = 0.070376836;
          auVar89._52_4_ = 0.070376836;
          auVar89._56_4_ = 0.070376836;
          auVar89._60_4_ = 0.070376836;
          auVar88._16_8_ = uStack_13b0;
          auVar88._0_16_ = local_13c0;
          auVar88._24_8_ = uStack_13a8;
          auVar88._32_8_ = uStack_13a0;
          auVar88._40_8_ = uStack_1398;
          auVar88._48_8_ = uStack_1390;
          auVar88._56_8_ = uStack_1388;
          auVar87._8_4_ = -0.1151461;
          auVar87._12_4_ = -0.1151461;
          auVar87._0_4_ = -0.1151461;
          auVar87._4_4_ = -0.1151461;
          auVar87._16_4_ = -0.1151461;
          auVar87._20_4_ = -0.1151461;
          auVar87._24_4_ = -0.1151461;
          auVar87._28_4_ = -0.1151461;
          auVar87._32_4_ = -0.1151461;
          auVar87._36_4_ = -0.1151461;
          auVar87._40_4_ = -0.1151461;
          auVar87._44_4_ = -0.1151461;
          auVar87._48_4_ = -0.1151461;
          auVar87._52_4_ = -0.1151461;
          auVar87._56_4_ = -0.1151461;
          auVar87._60_4_ = -0.1151461;
          auVar119 = vfmadd213ps_avx512f(auVar88,auVar89,auVar87);
          auVar86._16_8_ = uStack_13b0;
          auVar86._0_16_ = local_13c0;
          auVar86._24_8_ = uStack_13a8;
          auVar86._32_8_ = uStack_13a0;
          auVar86._40_8_ = uStack_1398;
          auVar86._48_8_ = uStack_1390;
          auVar86._56_8_ = uStack_1388;
          auVar85._8_4_ = 0.116769984;
          auVar85._12_4_ = 0.116769984;
          auVar85._0_4_ = 0.116769984;
          auVar85._4_4_ = 0.116769984;
          auVar85._16_4_ = 0.116769984;
          auVar85._20_4_ = 0.116769984;
          auVar85._24_4_ = 0.116769984;
          auVar85._28_4_ = 0.116769984;
          auVar85._32_4_ = 0.116769984;
          auVar85._36_4_ = 0.116769984;
          auVar85._40_4_ = 0.116769984;
          auVar85._44_4_ = 0.116769984;
          auVar85._48_4_ = 0.116769984;
          auVar85._52_4_ = 0.116769984;
          auVar85._56_4_ = 0.116769984;
          auVar85._60_4_ = 0.116769984;
          auVar119 = vfmadd213ps_avx512f(auVar86,auVar119,auVar85);
          auVar84._16_8_ = uStack_13b0;
          auVar84._0_16_ = local_13c0;
          auVar84._24_8_ = uStack_13a8;
          auVar84._32_8_ = uStack_13a0;
          auVar84._40_8_ = uStack_1398;
          auVar84._48_8_ = uStack_1390;
          auVar84._56_8_ = uStack_1388;
          auVar83._8_4_ = -0.12420141;
          auVar83._12_4_ = -0.12420141;
          auVar83._0_4_ = -0.12420141;
          auVar83._4_4_ = -0.12420141;
          auVar83._16_4_ = -0.12420141;
          auVar83._20_4_ = -0.12420141;
          auVar83._24_4_ = -0.12420141;
          auVar83._28_4_ = -0.12420141;
          auVar83._32_4_ = -0.12420141;
          auVar83._36_4_ = -0.12420141;
          auVar83._40_4_ = -0.12420141;
          auVar83._44_4_ = -0.12420141;
          auVar83._48_4_ = -0.12420141;
          auVar83._52_4_ = -0.12420141;
          auVar83._56_4_ = -0.12420141;
          auVar83._60_4_ = -0.12420141;
          auVar119 = vfmadd213ps_avx512f(auVar84,auVar119,auVar83);
          auVar82._16_8_ = uStack_13b0;
          auVar82._0_16_ = local_13c0;
          auVar82._24_8_ = uStack_13a8;
          auVar82._32_8_ = uStack_13a0;
          auVar82._40_8_ = uStack_1398;
          auVar82._48_8_ = uStack_1390;
          auVar82._56_8_ = uStack_1388;
          auVar81._8_4_ = 0.14249323;
          auVar81._12_4_ = 0.14249323;
          auVar81._0_4_ = 0.14249323;
          auVar81._4_4_ = 0.14249323;
          auVar81._16_4_ = 0.14249323;
          auVar81._20_4_ = 0.14249323;
          auVar81._24_4_ = 0.14249323;
          auVar81._28_4_ = 0.14249323;
          auVar81._32_4_ = 0.14249323;
          auVar81._36_4_ = 0.14249323;
          auVar81._40_4_ = 0.14249323;
          auVar81._44_4_ = 0.14249323;
          auVar81._48_4_ = 0.14249323;
          auVar81._52_4_ = 0.14249323;
          auVar81._56_4_ = 0.14249323;
          auVar81._60_4_ = 0.14249323;
          auVar119 = vfmadd213ps_avx512f(auVar82,auVar119,auVar81);
          auVar80._16_8_ = uStack_13b0;
          auVar80._0_16_ = local_13c0;
          auVar80._24_8_ = uStack_13a8;
          auVar80._32_8_ = uStack_13a0;
          auVar80._40_8_ = uStack_1398;
          auVar80._48_8_ = uStack_1390;
          auVar80._56_8_ = uStack_1388;
          auVar79._8_4_ = -0.16668057;
          auVar79._12_4_ = -0.16668057;
          auVar79._0_4_ = -0.16668057;
          auVar79._4_4_ = -0.16668057;
          auVar79._16_4_ = -0.16668057;
          auVar79._20_4_ = -0.16668057;
          auVar79._24_4_ = -0.16668057;
          auVar79._28_4_ = -0.16668057;
          auVar79._32_4_ = -0.16668057;
          auVar79._36_4_ = -0.16668057;
          auVar79._40_4_ = -0.16668057;
          auVar79._44_4_ = -0.16668057;
          auVar79._48_4_ = -0.16668057;
          auVar79._52_4_ = -0.16668057;
          auVar79._56_4_ = -0.16668057;
          auVar79._60_4_ = -0.16668057;
          auVar119 = vfmadd213ps_avx512f(auVar80,auVar119,auVar79);
          auVar78._16_8_ = uStack_13b0;
          auVar78._0_16_ = local_13c0;
          auVar78._24_8_ = uStack_13a8;
          auVar78._32_8_ = uStack_13a0;
          auVar78._40_8_ = uStack_1398;
          auVar78._48_8_ = uStack_1390;
          auVar78._56_8_ = uStack_1388;
          auVar77._8_4_ = 0.20000714;
          auVar77._12_4_ = 0.20000714;
          auVar77._0_4_ = 0.20000714;
          auVar77._4_4_ = 0.20000714;
          auVar77._16_4_ = 0.20000714;
          auVar77._20_4_ = 0.20000714;
          auVar77._24_4_ = 0.20000714;
          auVar77._28_4_ = 0.20000714;
          auVar77._32_4_ = 0.20000714;
          auVar77._36_4_ = 0.20000714;
          auVar77._40_4_ = 0.20000714;
          auVar77._44_4_ = 0.20000714;
          auVar77._48_4_ = 0.20000714;
          auVar77._52_4_ = 0.20000714;
          auVar77._56_4_ = 0.20000714;
          auVar77._60_4_ = 0.20000714;
          auVar119 = vfmadd213ps_avx512f(auVar78,auVar119,auVar77);
          auVar76._16_8_ = uStack_13b0;
          auVar76._0_16_ = local_13c0;
          auVar76._24_8_ = uStack_13a8;
          auVar76._32_8_ = uStack_13a0;
          auVar76._40_8_ = uStack_1398;
          auVar76._48_8_ = uStack_1390;
          auVar76._56_8_ = uStack_1388;
          auVar75._8_4_ = -0.24999994;
          auVar75._12_4_ = -0.24999994;
          auVar75._0_4_ = -0.24999994;
          auVar75._4_4_ = -0.24999994;
          auVar75._16_4_ = -0.24999994;
          auVar75._20_4_ = -0.24999994;
          auVar75._24_4_ = -0.24999994;
          auVar75._28_4_ = -0.24999994;
          auVar75._32_4_ = -0.24999994;
          auVar75._36_4_ = -0.24999994;
          auVar75._40_4_ = -0.24999994;
          auVar75._44_4_ = -0.24999994;
          auVar75._48_4_ = -0.24999994;
          auVar75._52_4_ = -0.24999994;
          auVar75._56_4_ = -0.24999994;
          auVar75._60_4_ = -0.24999994;
          auVar119 = vfmadd213ps_avx512f(auVar76,auVar119,auVar75);
          auVar74._16_8_ = uStack_13b0;
          auVar74._0_16_ = local_13c0;
          auVar74._24_8_ = uStack_13a8;
          auVar74._32_8_ = uStack_13a0;
          auVar74._40_8_ = uStack_1398;
          auVar74._48_8_ = uStack_1390;
          auVar74._56_8_ = uStack_1388;
          auVar73._8_4_ = 0.3333333;
          auVar73._12_4_ = 0.3333333;
          auVar73._0_4_ = 0.3333333;
          auVar73._4_4_ = 0.3333333;
          auVar73._16_4_ = 0.3333333;
          auVar73._20_4_ = 0.3333333;
          auVar73._24_4_ = 0.3333333;
          auVar73._28_4_ = 0.3333333;
          auVar73._32_4_ = 0.3333333;
          auVar73._36_4_ = 0.3333333;
          auVar73._40_4_ = 0.3333333;
          auVar73._44_4_ = 0.3333333;
          auVar73._48_4_ = 0.3333333;
          auVar73._52_4_ = 0.3333333;
          auVar73._56_4_ = 0.3333333;
          auVar73._60_4_ = 0.3333333;
          auVar119 = vfmadd213ps_avx512f(auVar74,auVar119,auVar73);
          auVar91._16_8_ = uStack_13b0;
          auVar91._0_16_ = local_13c0;
          auVar91._24_8_ = uStack_13a8;
          auVar91._32_8_ = uStack_13a0;
          auVar91._40_8_ = uStack_1398;
          auVar91._48_8_ = uStack_1390;
          auVar91._56_8_ = uStack_1388;
          auVar119 = vmulps_avx512f(auVar119,auVar91);
          auVar119 = vmulps_avx512f(auVar119,auVar118);
          uStack_14a8 = auVar103._24_8_;
          uStack_14a0 = auVar104._32_8_;
          uStack_1498 = auVar105._40_8_;
          uStack_1490 = auVar106._48_8_;
          uStack_1488 = auVar113._56_8_;
          auVar72._16_8_ = uStack_14b0;
          auVar72._0_16_ = local_14c0;
          auVar72._24_8_ = uStack_14a8;
          auVar72._32_8_ = uStack_14a0;
          auVar72._40_8_ = uStack_1498;
          auVar72._48_8_ = uStack_1490;
          auVar72._56_8_ = uStack_1488;
          auVar71._8_4_ = -0.00021219444;
          auVar71._12_4_ = -0.00021219444;
          auVar71._0_4_ = -0.00021219444;
          auVar71._4_4_ = -0.00021219444;
          auVar71._16_4_ = -0.00021219444;
          auVar71._20_4_ = -0.00021219444;
          auVar71._24_4_ = -0.00021219444;
          auVar71._28_4_ = -0.00021219444;
          auVar71._32_4_ = -0.00021219444;
          auVar71._36_4_ = -0.00021219444;
          auVar71._40_4_ = -0.00021219444;
          auVar71._44_4_ = -0.00021219444;
          auVar71._48_4_ = -0.00021219444;
          auVar71._52_4_ = -0.00021219444;
          auVar71._56_4_ = -0.00021219444;
          auVar71._60_4_ = -0.00021219444;
          auVar113 = vfmadd213ps_avx512f(auVar71,auVar72,auVar119);
          auVar96._8_4_ = 0.5;
          auVar96._12_4_ = 0.5;
          auVar96._0_4_ = 0.5;
          auVar96._4_4_ = 0.5;
          auVar96._16_4_ = 0.5;
          auVar96._20_4_ = 0.5;
          auVar96._24_4_ = 0.5;
          auVar96._28_4_ = 0.5;
          auVar96._32_4_ = 0.5;
          auVar96._36_4_ = 0.5;
          auVar96._40_4_ = 0.5;
          auVar96._44_4_ = 0.5;
          auVar96._48_4_ = 0.5;
          auVar96._52_4_ = 0.5;
          auVar96._56_4_ = 0.5;
          auVar96._60_4_ = 0.5;
          auVar113 = vfnmadd213ps_avx512f(auVar96,auVar118,auVar113);
          auVar67._16_8_ = uStack_13b0;
          auVar67._0_16_ = local_13c0;
          auVar67._24_8_ = uStack_13a8;
          auVar67._32_8_ = uStack_13a0;
          auVar67._40_8_ = uStack_1398;
          auVar67._48_8_ = uStack_1390;
          auVar67._56_8_ = uStack_1388;
          auVar113 = vaddps_avx512f(auVar67,auVar113);
          auVar70._16_8_ = uStack_14b0;
          auVar70._0_16_ = local_14c0;
          auVar70._24_8_ = uStack_14a8;
          auVar70._32_8_ = uStack_14a0;
          auVar70._40_8_ = uStack_1498;
          auVar70._48_8_ = uStack_1490;
          auVar70._56_8_ = uStack_1488;
          auVar69._8_4_ = 0.6933594;
          auVar69._12_4_ = 0.6933594;
          auVar69._0_4_ = 0.6933594;
          auVar69._4_4_ = 0.6933594;
          auVar69._16_4_ = 0.6933594;
          auVar69._20_4_ = 0.6933594;
          auVar69._24_4_ = 0.6933594;
          auVar69._28_4_ = 0.6933594;
          auVar69._32_4_ = 0.6933594;
          auVar69._36_4_ = 0.6933594;
          auVar69._40_4_ = 0.6933594;
          auVar69._44_4_ = 0.6933594;
          auVar69._48_4_ = 0.6933594;
          auVar69._52_4_ = 0.6933594;
          auVar69._56_4_ = 0.6933594;
          auVar69._60_4_ = 0.6933594;
          auVar118 = vfmadd213ps_avx512f(auVar69,auVar70,auVar113);
          auVar113 = vpmovm2d_avx512dq(uVar20 & 0xffff);
          auVar113 = vmovdqa64_avx512f(auVar113);
          auVar113 = vmovdqa64_avx512f(auVar113);
          auVar113 = vmovdqa64_avx512f(auVar113);
          auVar118 = vmovdqa64_avx512f(auVar118);
          auVar113 = vmovdqa64_avx512f(auVar113);
          auVar113 = vpord_avx512f(auVar118,auVar113);
          auVar113 = vmovdqa64_avx512f(auVar113);
          auVar119 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
          auVar115 = vbroadcastss_avx512f(ZEXT416(0x40000000));
          auVar113 = vmulps_avx512f(auVar113,auVar115);
          auVar116 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
          auVar113 = vsubps_avx512f(ZEXT1664(ZEXT816(0)),auVar113);
          auVar60._8_4_ = 88.37626;
          auVar60._12_4_ = 88.37626;
          auVar60._0_4_ = 88.37626;
          auVar60._4_4_ = 88.37626;
          auVar60._16_4_ = 88.37626;
          auVar60._20_4_ = 88.37626;
          auVar60._24_4_ = 88.37626;
          auVar60._28_4_ = 88.37626;
          auVar60._32_4_ = 88.37626;
          auVar60._36_4_ = 88.37626;
          auVar60._40_4_ = 88.37626;
          auVar60._44_4_ = 88.37626;
          auVar60._48_4_ = 88.37626;
          auVar60._52_4_ = 88.37626;
          auVar60._56_4_ = 88.37626;
          auVar60._60_4_ = 88.37626;
          auVar113 = vminps_avx512f(auVar113,auVar60);
          auVar59._8_4_ = -88.37626;
          auVar59._12_4_ = -88.37626;
          auVar59._0_4_ = -88.37626;
          auVar59._4_4_ = -88.37626;
          auVar59._16_4_ = -88.37626;
          auVar59._20_4_ = -88.37626;
          auVar59._24_4_ = -88.37626;
          auVar59._28_4_ = -88.37626;
          auVar59._32_4_ = -88.37626;
          auVar59._36_4_ = -88.37626;
          auVar59._40_4_ = -88.37626;
          auVar59._44_4_ = -88.37626;
          auVar59._48_4_ = -88.37626;
          auVar59._52_4_ = -88.37626;
          auVar59._56_4_ = -88.37626;
          auVar59._60_4_ = -88.37626;
          auVar118 = vmaxps_avx512f(auVar113,auVar59);
          auVar58._8_4_ = 1.442695;
          auVar58._12_4_ = 1.442695;
          auVar58._0_4_ = 1.442695;
          auVar58._4_4_ = 1.442695;
          auVar58._16_4_ = 1.442695;
          auVar58._20_4_ = 1.442695;
          auVar58._24_4_ = 1.442695;
          auVar58._28_4_ = 1.442695;
          auVar58._32_4_ = 1.442695;
          auVar58._36_4_ = 1.442695;
          auVar58._40_4_ = 1.442695;
          auVar58._44_4_ = 1.442695;
          auVar58._48_4_ = 1.442695;
          auVar58._52_4_ = 1.442695;
          auVar58._56_4_ = 1.442695;
          auVar58._60_4_ = 1.442695;
          auVar57._8_4_ = 0.5;
          auVar57._12_4_ = 0.5;
          auVar57._0_4_ = 0.5;
          auVar57._4_4_ = 0.5;
          auVar57._16_4_ = 0.5;
          auVar57._20_4_ = 0.5;
          auVar57._24_4_ = 0.5;
          auVar57._28_4_ = 0.5;
          auVar57._32_4_ = 0.5;
          auVar57._36_4_ = 0.5;
          auVar57._40_4_ = 0.5;
          auVar57._44_4_ = 0.5;
          auVar57._48_4_ = 0.5;
          auVar57._52_4_ = 0.5;
          auVar57._56_4_ = 0.5;
          auVar57._60_4_ = 0.5;
          auVar113 = vfmadd213ps_avx512f(auVar58,auVar118,auVar57);
          auVar117 = vrndscaleps_avx512f(auVar113,1);
          uVar19 = vcmpps_avx512f(auVar113,auVar117,1);
          uVar21 = (ushort)uVar19;
          auVar61._8_4_ = 1.0;
          auVar61._12_4_ = 1.0;
          auVar61._0_4_ = 1.0;
          auVar61._4_4_ = 1.0;
          auVar61._16_4_ = 1.0;
          auVar61._20_4_ = 1.0;
          auVar61._24_4_ = 1.0;
          auVar61._28_4_ = 1.0;
          auVar61._32_4_ = 1.0;
          auVar61._36_4_ = 1.0;
          auVar61._40_4_ = 1.0;
          auVar61._44_4_ = 1.0;
          auVar61._48_4_ = 1.0;
          auVar61._52_4_ = 1.0;
          auVar61._56_4_ = 1.0;
          auVar61._60_4_ = 1.0;
          local_19c0 = auVar117._0_4_;
          iStack_19bc = auVar117._4_4_;
          iStack_19b8 = auVar117._8_4_;
          iStack_19b4 = auVar117._12_4_;
          iStack_19b0 = auVar117._16_4_;
          iStack_19ac = auVar117._20_4_;
          iStack_19a8 = auVar117._24_4_;
          iStack_19a4 = auVar117._28_4_;
          iStack_19a0 = auVar117._32_4_;
          iStack_199c = auVar117._36_4_;
          iStack_1998 = auVar117._40_4_;
          iStack_1994 = auVar117._44_4_;
          iStack_1990 = auVar117._48_4_;
          iStack_198c = auVar117._52_4_;
          iStack_1988 = auVar117._56_4_;
          iStack_1984 = auVar117._60_4_;
          auVar113 = vsubps_avx512f(auVar117,auVar61);
          bVar4 = (bool)((byte)uVar19 & 1);
          bVar5 = (bool)((byte)(uVar21 >> 1) & 1);
          bVar6 = (bool)((byte)(uVar21 >> 2) & 1);
          bVar7 = (bool)((byte)(uVar21 >> 3) & 1);
          bVar8 = (bool)((byte)(uVar21 >> 4) & 1);
          bVar9 = (bool)((byte)(uVar21 >> 5) & 1);
          bVar10 = (bool)((byte)(uVar21 >> 6) & 1);
          bVar11 = (bool)((byte)(uVar21 >> 7) & 1);
          bVar12 = (byte)((ulong)uVar19 >> 8);
          bVar13 = (bool)(bVar12 >> 1 & 1);
          bVar14 = (bool)(bVar12 >> 2 & 1);
          bVar15 = (bool)(bVar12 >> 3 & 1);
          bVar16 = (bool)(bVar12 >> 4 & 1);
          bVar17 = (bool)(bVar12 >> 5 & 1);
          bVar18 = (bool)(bVar12 >> 6 & 1);
          local_23c0._4_4_ = (uint)bVar5 * auVar113._4_4_ | (uint)!bVar5 * iStack_19bc;
          local_23c0._0_4_ = (uint)bVar4 * auVar113._0_4_ | (uint)!bVar4 * local_19c0;
          local_23c0._8_4_ = (uint)bVar6 * auVar113._8_4_ | (uint)!bVar6 * iStack_19b8;
          local_23c0._12_4_ = (uint)bVar7 * auVar113._12_4_ | (uint)!bVar7 * iStack_19b4;
          uStack_23b0._0_4_ = (uint)bVar8 * auVar113._16_4_ | (uint)!bVar8 * iStack_19b0;
          uStack_23b0._4_4_ = (uint)bVar9 * auVar113._20_4_ | (uint)!bVar9 * iStack_19ac;
          uStack_23a8._0_4_ = (uint)bVar10 * auVar113._24_4_ | (uint)!bVar10 * iStack_19a8;
          uStack_23a8._4_4_ = (uint)bVar11 * auVar113._28_4_ | (uint)!bVar11 * iStack_19a4;
          auVar103 = _local_23c0;
          uStack_23a0._0_4_ =
               (uint)(bVar12 & 1) * auVar113._32_4_ | (uint)!(bool)(bVar12 & 1) * iStack_19a0;
          uStack_23a0._4_4_ = (uint)bVar13 * auVar113._36_4_ | (uint)!bVar13 * iStack_199c;
          auVar104 = _local_23c0;
          uStack_2398._0_4_ = (uint)bVar14 * auVar113._40_4_ | (uint)!bVar14 * iStack_1998;
          uStack_2398._4_4_ = (uint)bVar15 * auVar113._44_4_ | (uint)!bVar15 * iStack_1994;
          auVar105 = _local_23c0;
          uStack_2390._0_4_ = (uint)bVar16 * auVar113._48_4_ | (uint)!bVar16 * iStack_1990;
          uStack_2390._4_4_ = (uint)bVar17 * auVar113._52_4_ | (uint)!bVar17 * iStack_198c;
          auVar106 = _local_23c0;
          uStack_2388._0_4_ = (uint)bVar18 * auVar113._56_4_ | (uint)!bVar18 * iStack_1988;
          uStack_2388._4_4_ =
               (uint)(bVar12 >> 7) * auVar113._60_4_ | (uint)!(bool)(bVar12 >> 7) * iStack_1984;
          auVar113 = _local_23c0;
          uStack_23a8 = auVar103._24_8_;
          uStack_23a0 = auVar104._32_8_;
          uStack_2398 = auVar105._40_8_;
          uStack_2390 = auVar106._48_8_;
          uStack_2388 = auVar113._56_8_;
          auVar65._16_8_ = uStack_23b0;
          auVar65._0_16_ = local_23c0;
          auVar65._24_8_ = uStack_23a8;
          auVar65._32_8_ = uStack_23a0;
          auVar65._40_8_ = uStack_2398;
          auVar65._48_8_ = uStack_2390;
          auVar65._56_8_ = uStack_2388;
          auVar64._8_4_ = 0.6933594;
          auVar64._12_4_ = 0.6933594;
          auVar64._0_4_ = 0.6933594;
          auVar64._4_4_ = 0.6933594;
          auVar64._16_4_ = 0.6933594;
          auVar64._20_4_ = 0.6933594;
          auVar64._24_4_ = 0.6933594;
          auVar64._28_4_ = 0.6933594;
          auVar64._32_4_ = 0.6933594;
          auVar64._36_4_ = 0.6933594;
          auVar64._40_4_ = 0.6933594;
          auVar64._44_4_ = 0.6933594;
          auVar64._48_4_ = 0.6933594;
          auVar64._52_4_ = 0.6933594;
          auVar64._56_4_ = 0.6933594;
          auVar64._60_4_ = 0.6933594;
          auVar113 = vfnmadd213ps_avx512f(auVar64,auVar65,auVar118);
          auVar63._16_8_ = uStack_23b0;
          auVar63._0_16_ = local_23c0;
          auVar63._24_8_ = uStack_23a8;
          auVar63._32_8_ = uStack_23a0;
          auVar63._40_8_ = uStack_2398;
          auVar63._48_8_ = uStack_2390;
          auVar63._56_8_ = uStack_2388;
          auVar62._8_4_ = -0.00021219444;
          auVar62._12_4_ = -0.00021219444;
          auVar62._0_4_ = -0.00021219444;
          auVar62._4_4_ = -0.00021219444;
          auVar62._16_4_ = -0.00021219444;
          auVar62._20_4_ = -0.00021219444;
          auVar62._24_4_ = -0.00021219444;
          auVar62._28_4_ = -0.00021219444;
          auVar62._32_4_ = -0.00021219444;
          auVar62._36_4_ = -0.00021219444;
          auVar62._40_4_ = -0.00021219444;
          auVar62._44_4_ = -0.00021219444;
          auVar62._48_4_ = -0.00021219444;
          auVar62._52_4_ = -0.00021219444;
          auVar62._56_4_ = -0.00021219444;
          auVar62._60_4_ = -0.00021219444;
          auVar113 = vfnmadd213ps_avx512f(auVar62,auVar63,auVar113);
          auVar118 = vmulps_avx512f(auVar113,auVar113);
          local_24c0._8_4_ = 0.00019875691;
          local_24c0._12_4_ = 0.00019875691;
          local_24c0._0_4_ = 0.00019875691;
          local_24c0._4_4_ = 0.00019875691;
          auVar56._16_4_ = 0.00019875691;
          auVar56._20_4_ = 0.00019875691;
          auVar56._0_16_ = local_24c0._0_16_;
          auVar56._24_4_ = 0.00019875691;
          auVar56._28_4_ = 0.00019875691;
          auVar56._32_4_ = 0.00019875691;
          auVar56._36_4_ = 0.00019875691;
          auVar56._40_4_ = 0.00019875691;
          auVar56._44_4_ = 0.00019875691;
          auVar56._48_4_ = 0.00019875691;
          auVar56._52_4_ = 0.00019875691;
          auVar56._56_4_ = 0.00019875691;
          auVar56._60_4_ = 0.00019875691;
          auVar55._8_4_ = 0.0013981999;
          auVar55._12_4_ = 0.0013981999;
          auVar55._0_4_ = 0.0013981999;
          auVar55._4_4_ = 0.0013981999;
          auVar55._16_4_ = 0.0013981999;
          auVar55._20_4_ = 0.0013981999;
          auVar55._24_4_ = 0.0013981999;
          auVar55._28_4_ = 0.0013981999;
          auVar55._32_4_ = 0.0013981999;
          auVar55._36_4_ = 0.0013981999;
          auVar55._40_4_ = 0.0013981999;
          auVar55._44_4_ = 0.0013981999;
          auVar55._48_4_ = 0.0013981999;
          auVar55._52_4_ = 0.0013981999;
          auVar55._56_4_ = 0.0013981999;
          auVar55._60_4_ = 0.0013981999;
          auVar117 = vfmadd213ps_avx512f(auVar113,auVar56,auVar55);
          auVar54._8_4_ = 0.008333452;
          auVar54._12_4_ = 0.008333452;
          auVar54._0_4_ = 0.008333452;
          auVar54._4_4_ = 0.008333452;
          auVar54._16_4_ = 0.008333452;
          auVar54._20_4_ = 0.008333452;
          auVar54._24_4_ = 0.008333452;
          auVar54._28_4_ = 0.008333452;
          auVar54._32_4_ = 0.008333452;
          auVar54._36_4_ = 0.008333452;
          auVar54._40_4_ = 0.008333452;
          auVar54._44_4_ = 0.008333452;
          auVar54._48_4_ = 0.008333452;
          auVar54._52_4_ = 0.008333452;
          auVar54._56_4_ = 0.008333452;
          auVar54._60_4_ = 0.008333452;
          auVar117 = vfmadd213ps_avx512f(auVar113,auVar117,auVar54);
          auVar53._8_4_ = 0.041665796;
          auVar53._12_4_ = 0.041665796;
          auVar53._0_4_ = 0.041665796;
          auVar53._4_4_ = 0.041665796;
          auVar53._16_4_ = 0.041665796;
          auVar53._20_4_ = 0.041665796;
          auVar53._24_4_ = 0.041665796;
          auVar53._28_4_ = 0.041665796;
          auVar53._32_4_ = 0.041665796;
          auVar53._36_4_ = 0.041665796;
          auVar53._40_4_ = 0.041665796;
          auVar53._44_4_ = 0.041665796;
          auVar53._48_4_ = 0.041665796;
          auVar53._52_4_ = 0.041665796;
          auVar53._56_4_ = 0.041665796;
          auVar53._60_4_ = 0.041665796;
          auVar117 = vfmadd213ps_avx512f(auVar113,auVar117,auVar53);
          auVar52._8_4_ = 0.16666666;
          auVar52._12_4_ = 0.16666666;
          auVar52._0_4_ = 0.16666666;
          auVar52._4_4_ = 0.16666666;
          auVar52._16_4_ = 0.16666666;
          auVar52._20_4_ = 0.16666666;
          auVar52._24_4_ = 0.16666666;
          auVar52._28_4_ = 0.16666666;
          auVar52._32_4_ = 0.16666666;
          auVar52._36_4_ = 0.16666666;
          auVar52._40_4_ = 0.16666666;
          auVar52._44_4_ = 0.16666666;
          auVar52._48_4_ = 0.16666666;
          auVar52._52_4_ = 0.16666666;
          auVar52._56_4_ = 0.16666666;
          auVar52._60_4_ = 0.16666666;
          auVar117 = vfmadd213ps_avx512f(auVar113,auVar117,auVar52);
          auVar51._8_4_ = 0.5;
          auVar51._12_4_ = 0.5;
          auVar51._0_4_ = 0.5;
          auVar51._4_4_ = 0.5;
          auVar51._16_4_ = 0.5;
          auVar51._20_4_ = 0.5;
          auVar51._24_4_ = 0.5;
          auVar51._28_4_ = 0.5;
          auVar51._32_4_ = 0.5;
          auVar51._36_4_ = 0.5;
          auVar51._40_4_ = 0.5;
          auVar51._44_4_ = 0.5;
          auVar51._48_4_ = 0.5;
          auVar51._52_4_ = 0.5;
          auVar51._56_4_ = 0.5;
          auVar51._60_4_ = 0.5;
          auVar117 = vfmadd213ps_avx512f(auVar113,auVar117,auVar51);
          auVar113 = vfmadd213ps_avx512f(auVar118,auVar117,auVar113);
          auVar50._8_4_ = 1.0;
          auVar50._12_4_ = 1.0;
          auVar50._0_4_ = 1.0;
          auVar50._4_4_ = 1.0;
          auVar50._16_4_ = 1.0;
          auVar50._20_4_ = 1.0;
          auVar50._24_4_ = 1.0;
          auVar50._28_4_ = 1.0;
          auVar50._32_4_ = 1.0;
          auVar50._36_4_ = 1.0;
          auVar50._40_4_ = 1.0;
          auVar50._44_4_ = 1.0;
          auVar50._48_4_ = 1.0;
          auVar50._52_4_ = 1.0;
          auVar50._56_4_ = 1.0;
          auVar50._60_4_ = 1.0;
          auVar117 = vaddps_avx512f(auVar113,auVar50);
          auVar66._16_8_ = uStack_23b0;
          auVar66._0_16_ = local_23c0;
          auVar66._24_8_ = uStack_23a8;
          auVar66._32_8_ = uStack_23a0;
          auVar66._40_8_ = uStack_2398;
          auVar66._48_8_ = uStack_2390;
          auVar66._56_8_ = uStack_2388;
          auVar113 = vcvttps2dq_avx512f(auVar66);
          vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
          auVar113 = vmovdqa64_avx512f(auVar113);
          auVar113 = vmovdqa64_avx512f(auVar113);
          auVar118 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
          auVar113 = vmovdqa64_avx512f(auVar113);
          auVar118 = vmovdqa64_avx512f(auVar118);
          auVar113 = vmovdqa64_avx512f(auVar113);
          auVar118 = vmovdqa64_avx512f(auVar118);
          auVar113 = vpaddd_avx512f(auVar113,auVar118);
          auVar113 = vmovdqa64_avx512f(auVar113);
          auVar113 = vmovdqa64_avx512f(auVar113);
          auVar113 = vmovdqa64_avx512f(auVar113);
          auVar113 = vmovdqa64_avx512f(auVar113);
          auVar113 = vpslld_avx512f(auVar113,ZEXT416(0x17));
          auVar113 = vmovdqa64_avx512f(auVar113);
          auVar113 = vmovdqa64_avx512f(auVar113);
          auVar113 = vmovdqa64_avx512f(auVar113);
          auVar113 = vmovdqa64_avx512f(auVar113);
          auVar113 = vmovdqa64_avx512f(auVar113);
          auVar113 = vmulps_avx512f(auVar117,auVar113);
          auVar113 = vaddps_avx512f(auVar116,auVar113);
          auVar113 = vdivps_avx512f(auVar116,auVar113);
          auVar118 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
          auVar118 = vpxord_avx512f(auVar119,auVar118);
          auVar113 = vfmadd213ps_avx512f(auVar115,auVar113,auVar118);
          local_56c0 = vmulps_avx512f(local_5e00,auVar113);
          break;
        case 6:
          auVar113 = vbroadcastss_avx512f(ZEXT416(*(uint *)*plVar22));
          auVar118 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*plVar22 + 4)));
          auVar119 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
          auVar113 = vfmadd213ps_avx512f(auVar113,local_5e00,auVar118);
          auVar113 = vmaxps_avx512f(auVar113,ZEXT1664(ZEXT816(0)));
          auVar113 = vminps_avx512f(auVar113,auVar119);
          local_56c0 = vmulps_avx512f(auVar113,local_5e00);
          break;
        default:
          local_56c0 = local_5e00;
        }
        *local_5d18 = local_56c0;
        local_5d18 = local_5d18 + 1;
      }
    }
  }
  return;
}

Assistant:

static void deconvolution_pack1to16_avx512(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data_packed, const Mat& bias_data, int kernel_w, int kernel_h, int dilation_w, int dilation_h, int stride_w, int stride_h, int activation_type, const Mat& activation_params, const Option& opt)
{
    int outch = top_blob.c;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    const float* bias_data_ptr = bias_data;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* outptr = top_blob.channel(p);

        const int maxk = kernel_w * kernel_h;

        // shadowed variable for less openmp task args
        const int w = bottom_blob.w;
        const int h = bottom_blob.h;
        const int channels = bottom_blob.c;
        const int outw = top_blob.w;
        const int outh = top_blob.h;

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                __m512 _sum = _mm512_setzero_ps();

                if (bias_data_ptr)
                {
                    _sum = _mm512_loadu_ps(bias_data_ptr + p * 16);
                }

                const float* kptr = weight_data_packed.channel(p);

                // channels
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob.channel(q);

                    for (int y = 0; y < kernel_h; y++)
                    {
                        int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                        if (sys < 0 || sys % stride_h != 0)
                            continue;

                        int sy = sys / stride_h;
                        if (sy >= h)
                            continue;

                        const float* sptr = m.row(sy);

                        for (int x = 0; x < kernel_w; x++)
                        {
                            int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                            if (sxs < 0 || sxs % stride_w != 0)
                                continue;

                            int sx = sxs / stride_w;
                            if (sx >= w)
                                continue;

                            float val = sptr[sx];

                            int k = y * kernel_w + x;

                            __m512 _val = _mm512_set1_ps(val);
                            __m512 _w = _mm512_load_ps(kptr + k * 16);
                            _sum = _mm512_fmadd_ps(_val, _w, _sum);
                        }
                    }

                    kptr += maxk * 16;
                }

                _sum = activation_avx512(_sum, activation_type, activation_params);

                _mm512_storeu_ps(outptr, _sum);
                outptr += 16;
            }
        }
    }
}